

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  Split *pSVar2;
  char *pcVar3;
  pointer *pppTVar4;
  float fVar5;
  undefined8 uVar6;
  int iVar7;
  undefined4 uVar8;
  BBox1f BVar9;
  MemoryMonitorInterface *pMVar10;
  Split *pSVar11;
  vint *pvVar12;
  code *pcVar13;
  ThreadLocal2 *pTVar14;
  NodeRefPtr<4> this_00;
  iterator iVar15;
  BBox1f *pBVar16;
  PrimRefMB *pPVar17;
  Scene *pSVar18;
  Geometry *pGVar19;
  long lVar20;
  long lVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  vuint<4> vVar30;
  vint *pvVar31;
  undefined8 uVar32;
  byte bVar33;
  char cVar34;
  long lVar35;
  long lVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *this_01;
  BBox1f BVar37;
  void *pvVar38;
  ulong uVar39;
  float *pfVar40;
  size_t sVar41;
  undefined8 *puVar42;
  runtime_error *prVar43;
  BBox1f *pBVar44;
  uint *puVar45;
  long *plVar46;
  ulong *puVar47;
  byte bVar48;
  char *pcVar49;
  ulong uVar50;
  long lVar51;
  pointer *__ptr;
  BuildRecord *in_00;
  long lVar52;
  uint uVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  size_t i;
  PrimRefMB *pPVar57;
  uint uVar58;
  long lVar59;
  ulong uVar60;
  mvector<PrimRefMB> *prims;
  ulong uVar61;
  bool bVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar87;
  float fVar88;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar89;
  float fVar90;
  float fVar93;
  float fVar94;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar95;
  undefined1 auVar96 [16];
  float fVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  float fVar105;
  float fVar106;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar112;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar113;
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1e48 [16];
  long local_1e30;
  undefined1 local_1e28 [16];
  float local_1e18;
  undefined1 local_1e08 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  undefined1 local_1dd8 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1dc8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1db8 [2];
  PrimRefVector lprims;
  undefined1 local_1d88 [16];
  float local_1d78;
  PrimInfoMB right;
  PrimInfoMB left;
  anon_class_1_0_00000001 reduction;
  vuint<4> v2;
  undefined1 local_1bf8 [16];
  undefined1 auStack_1be8 [16];
  undefined1 local_1bd8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1bc8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bb8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1ba8;
  BBox1f local_1b98;
  size_t sStack_1b90;
  size_t sStack_1b88;
  size_t sStack_1b80;
  undefined1 auStack_1b78 [16];
  BBox1f local_1b68;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  vuint<4> geomID;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b08;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  size_t local_1aa8;
  size_t sStack_1aa0;
  size_t sStack_1a98;
  size_t sStack_1a90;
  undefined1 auStack_1a88 [16];
  BBox1f local_1a78;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19d8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  size_t local_18a8 [2];
  undefined8 local_1898;
  undefined8 uStack_1890;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888;
  undefined8 local_1878;
  undefined8 uStack_1870;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1868;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1858;
  ulong local_1848;
  ulong uStack_1840;
  size_t sStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  BBox1f BStack_1820;
  BBox1f local_1818;
  longlong local_1808;
  undefined8 uStack_1800;
  size_t local_17f8;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined1 auStack_17d8 [8];
  undefined1 auStack_17d0 [8];
  vuint<4> v0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17b8;
  undefined1 local_17a8 [16];
  undefined1 auStack_1798 [16];
  undefined1 local_1788 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  undefined1 local_1768 [16];
  ulong local_1758;
  ulong uStack_1750;
  size_t asStack_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  uint uStack_172c;
  BBox1f local_1728 [2];
  Split local_1718 [57];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  BBox1f local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar39 = in->depth;
  if ((this->cfg).maxDepth < uVar39) {
    puVar42 = (undefined8 *)__cxa_allocate_exception(0x30);
    v0.field_0.v[0] = (longlong)&local_17b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&v0,"depth limit reached","");
    *puVar42 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar42 + 1) = 1;
    puVar42[2] = puVar42 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar42 + 2),v0.field_0.v[0],v0.field_0.v[1] + v0.field_0.v[0]);
    __cxa_throw(puVar42,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  sVar41 = *(size_t *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.lower.field_0;
  uVar6 = *(undefined8 *)
           ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                   geomBounds.bounds0.lower.field_0 + 8);
  uVar22 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.upper.field_0;
  uVar23 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.upper.field_0 + 8);
  aVar27 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0;
  uVar24 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds1.upper.field_0;
  uVar25 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds1.upper.field_0 + 8);
  aVar29 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0;
  aVar28 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  BVar9 = (BBox1f)(in->prims).prims;
  uVar60 = (in->prims).super_PrimInfoMB.object_range._begin;
  uVar50 = (in->prims).super_PrimInfoMB.object_range._end;
  findFallback((Split *)&v0,this,&in->prims);
  local_1718[0].mapping.ofs.field_0._8_8_ = local_17a8._8_8_;
  local_1718[0].mapping.ofs.field_0._0_8_ = local_17a8._0_8_;
  local_1718[0].mapping.num = local_17b8._0_8_;
  local_18a8[0] = sVar41;
  local_18a8[1] = uVar6;
  local_1898 = uVar22;
  uStack_1890 = uVar23;
  local_1888 = aVar27;
  local_1878 = uVar24;
  uStack_1870 = uVar25;
  local_1868 = aVar29;
  local_1858 = aVar28;
  local_1848 = uVar60;
  uStack_1840 = uVar50;
  sStack_1838 = values[0].ref.ptr;
  uStack_1830 = values[0]._8_8_;
  uStack_1828 = values[0].lbounds.bounds0.lower.field_0._0_8_;
  BStack_1820.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  BStack_1820.upper = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar37 = BStack_1820;
  local_1818 = BVar9;
  uVar32 = v0.field_0.v[0];
  local_1808 = v0.field_0.v[0];
  uStack_1800 = v0.field_0.v[1];
  local_17f8 = local_17b8._0_8_;
  local_1718[0].mapping.scale.field_0._0_8_ = auStack_1798._0_8_;
  local_1718[0].mapping.scale.field_0._8_8_ = auStack_1798._8_8_;
  local_17e8 = local_17a8._0_8_;
  uStack_17e0 = local_17a8._8_8_;
  auStack_17d8 = (undefined1  [8])auStack_1798._0_8_;
  auStack_17d0 = (undefined1  [8])auStack_1798._8_8_;
  if ((uVar39 == 1) && (uVar50 != uVar60)) {
    BStack_1820.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    BStack_1820.upper = (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar35 = uVar50 - uVar60;
    if (uVar50 < uVar60 || lVar35 == 0) {
      auVar65 = ZEXT816(0xff8000007f800000);
    }
    else {
      pBVar44 = &(*(PrimRefMB **)((long)BVar9 + 0x20))[uVar60].time_range;
      auVar65 = ZEXT816(0xff8000007f800000);
      do {
        auVar79._8_8_ = 0;
        auVar79._0_4_ = pBVar44->lower;
        auVar79._4_4_ = pBVar44->upper;
        auVar67 = vcmpps_avx(auVar65,auVar79,1);
        auVar66 = vinsertps_avx(auVar65,auVar79,0x50);
        auVar65 = vblendps_avx(auVar79,auVar65,2);
        auVar65 = vblendvps_avx(auVar65,auVar66,auVar67);
        pBVar44 = pBVar44 + 10;
        lVar35 = lVar35 + -1;
      } while (lVar35 != 0);
    }
    auVar67 = vmovshdup_avx(auVar65);
    auVar67 = vcmpps_avx(auVar67,ZEXT416((uint)BStack_1820.upper),1);
    auVar65 = vcmpps_avx(ZEXT416((uint)BStack_1820.lower),auVar65,1);
    auVar65 = vorps_avx(auVar65,auVar67);
    bVar48 = auVar65[0] & 1;
  }
  else {
    bVar48 = 0;
  }
  BStack_1820 = BVar37;
  if (((uVar50 - uVar60 <= (this->cfg).maxLeafSize) &&
      (uStack_1800._4_4_ = v0.field_0._12_4_, uStack_1800._4_4_ < 2)) && (bVar48 == 0)) {
    uVar50 = (uVar50 - uVar60) + 3;
    uVar39 = uVar50 >> 2;
    geomID.field_0.v[0] = uVar39 * 0x50;
    this_00.ptr = (size_t)(alloc.talloc1)->parent;
    if (alloc.alloc != (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = this_00.ptr;
      MutexSys::lock((MutexSys *)this_00.ptr);
      if ((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p != (__pointer_type)0x0
         ) {
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xa8) + (long)*(void **)(this_00.ptr + 0x68);
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((long)*(void **)(this_00.ptr + 0x58) + (long)*(void **)(this_00.ptr + 0x98)) -
             ((long)*(void **)(this_00.ptr + 0x50) + (long)*(void **)(this_00.ptr + 0x90)));
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesWasted
        ;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xb0) + (long)*(void **)(this_00.ptr + 0x70);
        UNLOCK();
      }
      auVar65 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])(this_00.ptr + 0x58) = ZEXT1632(auVar65);
      *(undefined1 (*) [32])(this_00.ptr + 0x48) = ZEXT1632(auVar65);
      auVar72 = ZEXT1632(auVar65);
      if (alloc.alloc == (FastAllocator *)0x0) {
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar72;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar72;
      }
      else {
        *(void **)(this_00.ptr + 0x60) = (void *)(alloc.alloc)->defaultBlockSize;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar72;
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar72;
        *(void **)(this_00.ptr + 0xa0) = (void *)(alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p = alloc.alloc;
      UNLOCK();
      v2.field_0.v[0] = this_00.ptr;
      v0.field_0.v[1]._0_1_ = 1;
      v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar15._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar15._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar15,(ThreadLocal2 **)&v2);
      }
      else {
        *iVar15._M_current = (ThreadLocal2 *)v2.field_0.v[0];
        pppTVar4 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar4 = *pppTVar4 + 1;
      }
      if (v0.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)v0.field_0.v[0]);
      }
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + geomID.field_0.v[0];
    sVar41 = (alloc.talloc1)->cur;
    uVar56 = (ulong)(-(int)sVar41 & 0x1f);
    uVar54 = sVar41 + geomID.field_0.v[0] + uVar56;
    (alloc.talloc1)->cur = uVar54;
    if ((alloc.talloc1)->end < uVar54) {
      (alloc.talloc1)->cur = sVar41;
      if ((alloc.talloc1)->allocBlockSize < (ulong)(geomID.field_0.v[0] << 2)) {
        pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
      }
      else {
        v0.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
        pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc1)->ptr = pcVar49;
        sVar41 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar41;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = v0.field_0.v[0];
        (alloc.talloc1)->cur = geomID.field_0.v[0];
        if ((ulong)v0.field_0.v[0] < (ulong)geomID.field_0.v[0]) {
          (alloc.talloc1)->cur = 0;
          v0.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
          pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
          (alloc.talloc1)->ptr = pcVar49;
          sVar41 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar41;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = v0.field_0.v[0];
          (alloc.talloc1)->cur = geomID.field_0.v[0];
          if ((ulong)v0.field_0.v[0] < (ulong)geomID.field_0.v[0]) {
            (alloc.talloc1)->cur = 0;
            pcVar49 = (char *)0x0;
            goto LAB_013f5dfd;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar41;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar56;
      pcVar49 = (alloc.talloc1)->ptr + (uVar54 - geomID.field_0._0_8_);
    }
LAB_013f5dfd:
    uVar54 = 7;
    if (uVar39 < 7) {
      uVar54 = uVar39;
    }
    if (uVar50 < 4) {
      auVar69._8_4_ = 0x7f800000;
      auVar69._0_8_ = 0x7f8000007f800000;
      auVar69._12_4_ = 0x7f800000;
      local_1d88._8_4_ = 0xff800000;
      local_1d88._0_8_ = 0xff800000ff800000;
      local_1d88._12_4_ = 0xff800000;
      local_1dd8._8_4_ = 0xff800000;
      local_1dd8._0_8_ = 0xff800000ff800000;
      local_1dd8._12_4_ = 0xff800000;
      local_1e08 = auVar69;
    }
    else {
      auVar69._8_4_ = 0x7f800000;
      auVar69._0_8_ = 0x7f8000007f800000;
      auVar69._12_4_ = 0x7f800000;
      local_1e30 = 0;
      auVar115 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar114 = ZEXT1664(ZEXT816(0) << 0x40);
      local_1dd8._8_4_ = 0xff800000;
      local_1dd8._0_8_ = 0xff800000ff800000;
      local_1dd8._12_4_ = 0xff800000;
      local_1d88._8_4_ = 0xff800000;
      local_1d88._0_8_ = 0xff800000ff800000;
      local_1d88._12_4_ = 0xff800000;
      local_1e08 = auVar69;
      do {
        pPVar17 = *(PrimRefMB **)((long)local_1818 + 0x20);
        pSVar18 = ((this->createLeaf).bvh)->scene;
        auVar70._8_8_ = 0;
        auVar70._0_4_ = BStack_1820.lower;
        auVar70._4_4_ = BStack_1820.upper;
        v2.field_0 = auVar115._0_16_;
        auVar71._8_8_ = 0;
        auVar71._0_4_ = BStack_1820.lower;
        auVar71._4_4_ = BStack_1820.upper;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)vpcmpeqd_avx(auVar70,auVar71);
        pPVar57 = pPVar17 + uVar60;
        lVar35 = 0;
        geomID.field_0 =
             (anon_union_16_2_9473010e_for_vuint_impl<4>_1)
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0;
        v0.field_0 = v2.field_0;
        values[0]._0_16_ = (undefined1  [16])v2.field_0;
        do {
          if (uVar60 < uStack_1840) {
            fVar5 = (pPVar57->lbounds).bounds0.lower.field_0.m128[3];
            *(float *)((long)&geomID.field_0 + lVar35) = fVar5;
            fVar102 = (pPVar57->lbounds).bounds0.upper.field_0.m128[3];
            *(float *)((long)&left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                              .lower.field_0 + lVar35) = fVar102;
            pGVar19 = (pSVar18->geometries).items[(uint)fVar5].ptr;
            lVar36 = *(long *)&pGVar19->field_0x58;
            lVar51 = (ulong)(uint)fVar102 *
                     pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
            uVar53 = *(uint *)&pGVar19[1].intersectionFilterN >> 2;
            *(uint *)((long)&v0.field_0 + lVar35) = *(int *)(lVar36 + lVar51) * uVar53;
            *(uint *)((long)&values[0].ref.ptr + lVar35) = *(int *)(lVar36 + 4 + lVar51) * uVar53;
            *(uint *)((long)&v2.field_0 + lVar35) = uVar53 * *(int *)(lVar36 + 8 + lVar51);
            uVar60 = uVar60 + 1;
          }
          else if (lVar35 != 0) {
            *(uint *)((long)&geomID.field_0 + lVar35) = geomID.field_0.i[0];
            *(undefined4 *)
             ((long)&left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0 + lVar35) = 0xffffffff;
            uVar8 = v0.field_0.i[0];
            *(uint *)((long)&v0.field_0 + lVar35) = v0.field_0.i[0];
            *(undefined4 *)((long)&values[0].ref.ptr + lVar35) = uVar8;
            *(undefined4 *)((long)&v2.field_0 + lVar35) = uVar8;
          }
          if (uVar60 < uStack_1840) {
            pPVar57 = pPVar17 + uVar60;
          }
          lVar35 = lVar35 + 4;
        } while (lVar35 != 0x10);
        lVar35 = local_1e30 * 0x50;
        *(longlong *)(pcVar49 + lVar35) = v0.field_0.v[0];
        *(longlong *)((long)(pcVar49 + lVar35) + 8) = v0.field_0.v[1];
        *(size_t *)(pcVar49 + lVar35 + 0x10) = values[0].ref.ptr;
        *(undefined8 *)((long)(pcVar49 + lVar35 + 0x10) + 8) = values[0]._8_8_;
        *(longlong *)(pcVar49 + lVar35 + 0x20) = v2.field_0.v[0];
        *(longlong *)((long)(pcVar49 + lVar35 + 0x20) + 8) = v2.field_0.v[1];
        *(longlong *)(pcVar49 + lVar35 + 0x30) = geomID.field_0.v[0];
        *(longlong *)((long)(pcVar49 + lVar35 + 0x30) + 8) = geomID.field_0.v[1];
        *(undefined8 *)(pcVar49 + lVar35 + 0x40) =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        *(undefined8 *)(pcVar49 + lVar35 + 0x40 + 8) =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        auVar66 = vmovshdup_avx(auVar70);
        lVar36 = 0;
        auVar78._8_4_ = 0xff800000;
        auVar78._0_8_ = 0xff800000ff800000;
        auVar78._12_4_ = 0xff800000;
        auVar117._8_4_ = 0x7f800000;
        auVar117._0_8_ = 0x7f8000007f800000;
        auVar117._12_4_ = 0x7f800000;
        auVar67 = auVar117;
        auVar65 = auVar78;
        do {
          if ((ulong)*(uint *)(pcVar49 + lVar36 * 4 + lVar35 + 0x40) == 0xffffffff) break;
          pGVar19 = (pSVar18->geometries).items[*(uint *)(pcVar49 + lVar36 * 4 + lVar35 + 0x30)].ptr
          ;
          fVar5 = pGVar19->fnumTimeSegments;
          fVar102 = (pGVar19->time_range).lower;
          local_1e18 = BStack_1820.lower;
          fVar81 = (pGVar19->time_range).upper - fVar102;
          fVar63 = (local_1e18 - fVar102) / fVar81;
          local_1d78 = auVar66._0_4_;
          fVar81 = (local_1d78 - fVar102) / fVar81;
          fVar102 = fVar5 * fVar63;
          fVar97 = fVar5 * fVar81;
          auVar82 = vroundss_avx(ZEXT416((uint)fVar102),ZEXT416((uint)fVar102),9);
          auVar68 = vroundss_avx(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),10);
          auVar76 = auVar114._0_16_;
          auVar79 = vmaxss_avx(auVar82,auVar76);
          auVar75 = vminss_avx(auVar68,ZEXT416((uint)fVar5));
          fVar90 = auVar75._0_4_;
          iVar7 = (int)auVar82._0_4_;
          if ((int)auVar82._0_4_ < 0) {
            iVar7 = -1;
          }
          uVar53 = (int)fVar5 + 1U;
          if ((int)auVar68._0_4_ < (int)((int)fVar5 + 1U)) {
            uVar53 = (int)auVar68._0_4_;
          }
          lVar52 = (ulong)*(uint *)(pcVar49 + lVar36 * 4 + lVar35 + 0x40) *
                   pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar51 = *(long *)&pGVar19->field_0x58;
          uVar61 = (ulong)*(uint *)(lVar51 + lVar52);
          uVar56 = (ulong)*(uint *)(lVar51 + 4 + lVar52);
          lVar20 = *(long *)&pGVar19[2].numPrimitives;
          lVar59 = (long)(int)auVar79._0_4_ * 0x38;
          lVar21 = *(long *)(lVar20 + lVar59);
          lVar55 = *(long *)(lVar20 + 0x10 + lVar59);
          auVar75 = *(undefined1 (*) [16])(lVar21 + lVar55 * uVar61);
          auVar82 = *(undefined1 (*) [16])(lVar21 + lVar55 * uVar56);
          uVar50 = (ulong)*(uint *)(lVar51 + 8 + lVar52);
          auVar68 = *(undefined1 (*) [16])(lVar21 + lVar55 * uVar50);
          lVar55 = (long)(int)fVar90 * 0x38;
          lVar51 = *(long *)(lVar20 + lVar55);
          lVar21 = *(long *)(lVar20 + 0x10 + lVar55);
          auVar77 = *(undefined1 (*) [16])(lVar51 + lVar21 * uVar61);
          auVar64 = *(undefined1 (*) [16])(lVar51 + lVar21 * uVar56);
          auVar73 = *(undefined1 (*) [16])(lVar51 + lVar21 * uVar50);
          auVar74 = vminps_avx(auVar75,auVar82);
          auVar75 = vmaxps_avx(auVar75,auVar82);
          auVar74 = vminps_avx(auVar74,auVar68);
          auVar75 = vmaxps_avx(auVar75,auVar68);
          auVar82 = vminps_avx(auVar77,auVar64);
          auVar68 = vminps_avx(auVar82,auVar73);
          auVar82 = vmaxps_avx(auVar77,auVar64);
          auVar82 = vmaxps_avx(auVar82,auVar73);
          auVar79 = ZEXT416((uint)(fVar102 - auVar79._0_4_));
          fVar87 = auVar74._0_4_;
          fVar118 = auVar75._0_4_;
          fVar119 = auVar75._4_4_;
          fVar120 = auVar75._8_4_;
          fVar121 = auVar75._12_4_;
          fVar102 = auVar68._0_4_;
          fVar105 = auVar68._4_4_;
          fVar106 = auVar68._8_4_;
          fVar107 = auVar68._12_4_;
          fVar94 = auVar82._0_4_;
          fVar95 = auVar82._4_4_;
          fVar112 = auVar82._8_4_;
          fVar113 = auVar82._12_4_;
          fVar88 = auVar74._4_4_;
          fVar89 = auVar74._8_4_;
          fVar93 = auVar74._12_4_;
          if (uVar53 - iVar7 == 1) {
            auVar79 = vmaxss_avx(auVar79,auVar76);
            auVar75 = vshufps_avx(auVar79,auVar79,0);
            auVar79 = ZEXT416((uint)(1.0 - auVar79._0_4_));
            auVar79 = vshufps_avx(auVar79,auVar79,0);
            auVar80._0_4_ = fVar87 * auVar79._0_4_ + fVar102 * auVar75._0_4_;
            auVar80._4_4_ = fVar88 * auVar79._4_4_ + fVar105 * auVar75._4_4_;
            auVar80._8_4_ = fVar89 * auVar79._8_4_ + fVar106 * auVar75._8_4_;
            auVar80._12_4_ = fVar93 * auVar79._12_4_ + fVar107 * auVar75._12_4_;
            auVar96._0_4_ = fVar118 * auVar79._0_4_ + fVar94 * auVar75._0_4_;
            auVar96._4_4_ = fVar119 * auVar79._4_4_ + fVar95 * auVar75._4_4_;
            auVar96._8_4_ = fVar120 * auVar79._8_4_ + fVar112 * auVar75._8_4_;
            auVar96._12_4_ = fVar121 * auVar79._12_4_ + fVar113 * auVar75._12_4_;
            auVar79 = vmaxss_avx(ZEXT416((uint)(fVar90 - fVar97)),auVar76);
            auVar75 = vshufps_avx(auVar79,auVar79,0);
            auVar79 = ZEXT416((uint)(1.0 - auVar79._0_4_));
            auVar79 = vshufps_avx(auVar79,auVar79,0);
            auVar86._0_4_ = fVar87 * auVar75._0_4_ + fVar102 * auVar79._0_4_;
            auVar86._4_4_ = fVar88 * auVar75._4_4_ + fVar105 * auVar79._4_4_;
            auVar86._8_4_ = fVar89 * auVar75._8_4_ + fVar106 * auVar79._8_4_;
            auVar86._12_4_ = fVar93 * auVar75._12_4_ + fVar107 * auVar79._12_4_;
            auVar92._0_4_ = fVar118 * auVar75._0_4_ + fVar94 * auVar79._0_4_;
            auVar92._4_4_ = fVar119 * auVar75._4_4_ + fVar95 * auVar79._4_4_;
            auVar92._8_4_ = fVar120 * auVar75._8_4_ + fVar112 * auVar79._8_4_;
            auVar92._12_4_ = fVar121 * auVar75._12_4_ + fVar113 * auVar79._12_4_;
          }
          else {
            lVar51 = *(long *)(lVar20 + 0x38 + lVar59);
            lVar21 = *(long *)(lVar20 + 0x48 + lVar59);
            auVar75 = *(undefined1 (*) [16])(lVar51 + lVar21 * uVar61);
            auVar82 = *(undefined1 (*) [16])(lVar51 + lVar21 * uVar56);
            auVar68 = *(undefined1 (*) [16])(lVar51 + lVar21 * uVar50);
            auVar76 = vminps_avx(auVar75,auVar82);
            auVar77 = vminps_avx(auVar76,auVar68);
            auVar75 = vmaxps_avx(auVar75,auVar82);
            auVar76 = vmaxps_avx(auVar75,auVar68);
            lVar51 = *(long *)(lVar20 + -0x38 + lVar55);
            lVar21 = *(long *)(lVar20 + -0x28 + lVar55);
            auVar75 = *(undefined1 (*) [16])(lVar51 + lVar21 * uVar61);
            auVar82 = *(undefined1 (*) [16])(lVar51 + lVar21 * uVar56);
            auVar68 = *(undefined1 (*) [16])(lVar51 + lVar21 * uVar50);
            auVar64 = vminps_avx(auVar75,auVar82);
            auVar64 = vminps_avx(auVar64,auVar68);
            auVar75 = vmaxps_avx(auVar75,auVar82);
            auVar75 = vmaxps_avx(auVar75,auVar68);
            auVar79 = vmaxss_avx(auVar79,ZEXT816(0) << 0x40);
            auVar82 = vshufps_avx(auVar79,auVar79,0);
            auVar79 = ZEXT416((uint)(1.0 - auVar79._0_4_));
            auVar79 = vshufps_avx(auVar79,auVar79,0);
            auVar80._0_4_ = fVar87 * auVar79._0_4_ + auVar82._0_4_ * auVar77._0_4_;
            auVar80._4_4_ = fVar88 * auVar79._4_4_ + auVar82._4_4_ * auVar77._4_4_;
            auVar80._8_4_ = fVar89 * auVar79._8_4_ + auVar82._8_4_ * auVar77._8_4_;
            auVar80._12_4_ = fVar93 * auVar79._12_4_ + auVar82._12_4_ * auVar77._12_4_;
            auVar96._0_4_ = fVar118 * auVar79._0_4_ + auVar82._0_4_ * auVar76._0_4_;
            auVar96._4_4_ = fVar119 * auVar79._4_4_ + auVar82._4_4_ * auVar76._4_4_;
            auVar96._8_4_ = fVar120 * auVar79._8_4_ + auVar82._8_4_ * auVar76._8_4_;
            auVar96._12_4_ = fVar121 * auVar79._12_4_ + auVar82._12_4_ * auVar76._12_4_;
            auVar79 = vmaxss_avx(ZEXT416((uint)(fVar90 - fVar97)),ZEXT416(0));
            auVar82 = vshufps_avx(auVar79,auVar79,0);
            auVar79 = ZEXT416((uint)(1.0 - auVar79._0_4_));
            auVar79 = vshufps_avx(auVar79,auVar79,0);
            auVar86._0_4_ = auVar79._0_4_ * fVar102 + auVar64._0_4_ * auVar82._0_4_;
            auVar86._4_4_ = auVar79._4_4_ * fVar105 + auVar64._4_4_ * auVar82._4_4_;
            auVar86._8_4_ = auVar79._8_4_ * fVar106 + auVar64._8_4_ * auVar82._8_4_;
            auVar86._12_4_ = auVar79._12_4_ * fVar107 + auVar64._12_4_ * auVar82._12_4_;
            auVar92._0_4_ = auVar79._0_4_ * fVar94 + auVar82._0_4_ * auVar75._0_4_;
            auVar92._4_4_ = auVar79._4_4_ * fVar95 + auVar82._4_4_ * auVar75._4_4_;
            auVar92._8_4_ = auVar79._8_4_ * fVar112 + auVar82._8_4_ * auVar75._8_4_;
            auVar92._12_4_ = auVar79._12_4_ * fVar113 + auVar82._12_4_ * auVar75._12_4_;
            uVar58 = iVar7 + 1;
            if ((int)uVar58 < (int)uVar53) {
              plVar46 = (long *)(lVar20 + (ulong)uVar58 * 0x38 + 0x10);
              auVar115 = ZEXT864(0) << 0x20;
              do {
                auVar100._0_4_ = ((float)(int)uVar58 / fVar5 - fVar63) / (fVar81 - fVar63);
                auVar100._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar79 = vshufps_avx(auVar100,auVar100,0);
                fVar87 = auVar86._4_4_;
                fVar88 = auVar86._8_4_;
                fVar89 = auVar86._12_4_;
                auVar75 = vshufps_avx(ZEXT416((uint)(1.0 - auVar100._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar100._0_4_)),0);
                fVar102 = auVar80._4_4_;
                fVar90 = auVar80._8_4_;
                fVar106 = auVar80._12_4_;
                auVar109._0_4_ = auVar86._0_4_ * auVar79._0_4_ + auVar75._0_4_ * auVar80._0_4_;
                auVar109._4_4_ = fVar87 * auVar79._4_4_ + auVar75._4_4_ * fVar102;
                auVar109._8_4_ = fVar88 * auVar79._8_4_ + auVar75._8_4_ * fVar90;
                auVar109._12_4_ = fVar89 * auVar79._12_4_ + auVar75._12_4_ * fVar106;
                fVar93 = auVar92._4_4_;
                fVar94 = auVar92._8_4_;
                fVar95 = auVar92._12_4_;
                fVar97 = auVar96._4_4_;
                fVar105 = auVar96._8_4_;
                fVar107 = auVar96._12_4_;
                auVar101._0_4_ = auVar75._0_4_ * auVar96._0_4_ + auVar92._0_4_ * auVar79._0_4_;
                auVar101._4_4_ = auVar75._4_4_ * fVar97 + fVar93 * auVar79._4_4_;
                auVar101._8_4_ = auVar75._8_4_ * fVar105 + fVar94 * auVar79._8_4_;
                auVar101._12_4_ = auVar75._12_4_ * fVar107 + fVar95 * auVar79._12_4_;
                lVar51 = plVar46[-2];
                lVar20 = *plVar46;
                auVar79 = *(undefined1 (*) [16])(lVar51 + lVar20 * uVar61);
                auVar75 = *(undefined1 (*) [16])(lVar51 + lVar20 * uVar56);
                auVar82 = *(undefined1 (*) [16])(lVar51 + lVar20 * uVar50);
                auVar68 = vminps_avx(auVar79,auVar75);
                auVar68 = vminps_avx(auVar68,auVar82);
                auVar68 = vsubps_avx(auVar68,auVar109);
                auVar79 = vmaxps_avx(auVar79,auVar75);
                auVar79 = vmaxps_avx(auVar79,auVar82);
                auVar79 = vsubps_avx(auVar79,auVar101);
                auVar75 = vminps_avx(auVar68,ZEXT816(0) << 0x20);
                auVar79 = vmaxps_avx(auVar79,ZEXT816(0) << 0x20);
                auVar80._0_4_ = auVar75._0_4_ + auVar80._0_4_;
                auVar80._4_4_ = auVar75._4_4_ + fVar102;
                auVar80._8_4_ = auVar75._8_4_ + fVar90;
                auVar80._12_4_ = auVar75._12_4_ + fVar106;
                auVar86._0_4_ = auVar75._0_4_ + auVar86._0_4_;
                auVar86._4_4_ = auVar75._4_4_ + fVar87;
                auVar86._8_4_ = auVar75._8_4_ + fVar88;
                auVar86._12_4_ = auVar75._12_4_ + fVar89;
                auVar96._0_4_ = auVar96._0_4_ + auVar79._0_4_;
                auVar96._4_4_ = fVar97 + auVar79._4_4_;
                auVar96._8_4_ = fVar105 + auVar79._8_4_;
                auVar96._12_4_ = fVar107 + auVar79._12_4_;
                auVar92._0_4_ = auVar92._0_4_ + auVar79._0_4_;
                auVar92._4_4_ = fVar93 + auVar79._4_4_;
                auVar92._8_4_ = fVar94 + auVar79._8_4_;
                auVar92._12_4_ = fVar95 + auVar79._12_4_;
                uVar58 = uVar58 + 1;
                plVar46 = plVar46 + 7;
              } while (uVar53 != uVar58);
            }
            else {
              auVar115 = ZEXT864(0) << 0x40;
            }
          }
          auVar67 = vminps_avx(auVar67,auVar80);
          auVar78 = vmaxps_avx(auVar78,auVar96);
          auVar117 = vminps_avx(auVar117,auVar86);
          auVar65 = vmaxps_avx(auVar65,auVar92);
          lVar36 = lVar36 + 1;
          auVar114 = ZEXT1664(ZEXT816(0) << 0x40);
        } while (lVar36 != 4);
        local_1dd8 = vmaxps_avx(local_1dd8,auVar65);
        local_1e08 = vminps_avx(local_1e08,auVar117);
        local_1d88 = vmaxps_avx(local_1d88,auVar78);
        auVar69 = vminps_avx(auVar69,auVar67);
        local_1e30 = local_1e30 + 1;
      } while (local_1e30 != uVar39 + (uVar39 == 0));
    }
    (__return_storage_ptr__->ref).ptr = uVar54 | (ulong)pcVar49 | 8;
    *(undefined1 (*) [16])(__return_storage_ptr__->lbounds).bounds0.lower.field_0.m128 = auVar69;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1d88._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1d88._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1e08._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1e08._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1dd8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         local_1dd8._8_8_;
    __return_storage_ptr__->dt = BStack_1820;
    return __return_storage_ptr__;
  }
  lVar35 = 0xbc;
  do {
    *(undefined8 *)(auStack_17d8 + lVar35 + 4) = 0xffffffff7f800000;
    *(undefined8 *)(auStack_17d0 + lVar35 + 4) = 0;
    lVar35 = lVar35 + 0xf0;
  } while (lVar35 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  v0.field_0.v[0] = uVar39;
  vVar30.field_0 = v0.field_0;
  local_17b8._0_8_ = sVar41;
  local_17b8._8_8_ = uVar6;
  local_17a8._0_8_ = uVar22;
  local_17a8._8_8_ = uVar23;
  auStack_1798 = (undefined1  [16])aVar27;
  local_1788._0_8_ = uVar24;
  local_1788._8_8_ = uVar25;
  local_1778 = aVar29;
  local_1768 = (undefined1  [16])aVar28;
  local_1758 = uVar60;
  uStack_1750 = uVar50;
  asStack_1748[0] = values[0].ref.ptr;
  asStack_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  uStack_172c = values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar9;
  v0.field_0._0_4_ = (undefined4)uVar32;
  v0.field_0._4_4_ = SUB84(uVar32,4);
  local_1718[0].sah = (float)v0.field_0._0_4_;
  local_1718[0].dim = v0.field_0._4_4_;
  local_1718[0].field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)v0.field_0._8_4_;
  local_1718[0].data = v0.field_0._12_4_;
  local_840 = BVar9;
  local_838[0].lower = 2.8026e-45;
  local_838[0].upper = 0.0;
  local_8c8[0] = &local_840;
  local_1db8[0].i[2] = 0x7f800000;
  local_1db8[0]._0_8_ = 0x7f8000007f800000;
  local_1db8[0].i[3] = 0x7f800000;
  local_1dc8.i[2] = 0xff800000;
  local_1dc8._0_8_ = 0xff800000ff800000;
  local_1dc8.i[3] = 0xff800000;
  bVar33 = 0;
  v0.field_0 = vVar30.field_0;
  do {
    if (local_848 == 0) {
      uVar60 = 0xffffffffffffffff;
    }
    else {
      uVar60 = 0xffffffffffffffff;
      puVar47 = &local_1758;
      uVar50 = 0;
      uVar54 = 0;
      do {
        uVar56 = puVar47[1] - *puVar47;
        if ((((this->cfg).maxLeafSize < uVar56) || (1 < *(uint *)((long)(puVar47 + 9) + 4))) ||
           (bVar48 != 0)) {
          if (uVar50 < uVar56) {
            uVar60 = uVar54;
            uVar50 = uVar56;
          }
          bVar48 = 0;
        }
        uVar54 = uVar54 + 1;
        puVar47 = puVar47 + 0x1e;
      } while (local_848 != uVar54);
    }
    if (uVar60 != 0xffffffffffffffff) {
      lVar35 = uVar60 * 0xf0;
      v2.field_0.v[0] = uVar39 + 1;
      local_1b58 = 0xffffffff7f800000;
      uStack_1b50 = 0;
      geomID.field_0.v[0] = uVar39 + 1;
      local_1a68 = 0xffffffff7f800000;
      uStack_1a60 = 0;
      pSVar2 = (Split *)((long)local_1718 + lVar35);
      iVar7 = *(int *)((long)local_1718 + lVar35 + 0xc);
      if (iVar7 == 0) {
        BVar9 = *(BBox1f *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8);
        sVar41 = *(size_t *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8);
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[0]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[1]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        left.max_time_range.lower = 0.0;
        left.object_range._begin = 0;
        left.object_range._end = 0;
        left.num_time_segments = 0;
        left.max_num_time_segments = 0;
        auVar84._8_4_ = 0x3f800000;
        auVar84._0_8_ = &DAT_3f8000003f800000;
        auVar84._12_4_ = 0x3f800000;
        uVar6 = vmovlps_avx(auVar84);
        left.max_time_range.upper = (float)uVar6;
        left.time_range.lower = (float)((ulong)uVar6 >> 0x20);
        left.time_range.upper = 0.0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        uVar6 = vmovlps_avx(auVar84);
        right.max_time_range.upper = (float)uVar6;
        right.time_range.lower = (float)((ulong)uVar6 >> 0x20);
        right.time_range.upper = 0.0;
        vSplitPos.field_0.i[1] = *(undefined4 *)((long)local_1718 + lVar35 + 8);
        vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
        lVar36 = (long)(1 << (*(byte *)((long)local_1718 + lVar35 + 4) & 0x1f)) * 0x10;
        vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar36);
        vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar36 + 8);
        isLeft.split = pSVar2;
        isLeft.vSplitPos = &vSplitPos;
        isLeft.vSplitMask = &vSplitMask;
        sStack_1b90 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                (*(PrimRefMB **)((long)local_1728[uVar60 * 0x1e] + 0x20),
                                 (size_t)BVar9,sVar41,(EmptyTy *)local_19d8,&left,&right,&isLeft,
                                 &reduction,&reduction2,0x80,0xc00);
        local_1b68 = local_1728[uVar60 * 0x1e];
        auVar64._8_8_ = 0;
        auVar64._0_4_ = local_1728[uVar60 * 0x1e + -1].lower;
        auVar64._4_4_ = local_1728[uVar60 * 0x1e + -1].upper;
        auStack_1be8._4_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[1];
        auStack_1be8._0_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[0];
        auStack_1be8._12_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[3];
        auStack_1be8._8_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[2];
        local_1bd8._4_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[1];
        local_1bd8._0_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[0];
        local_1bd8._12_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[3];
        local_1bd8._8_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[2];
        aStack_1bc8.m128[1] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             m128[1];
        aStack_1bc8.m128[0] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             m128[0];
        aStack_1bc8.m128[3] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             m128[3];
        aStack_1bc8.m128[2] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             m128[2];
        local_1bb8.m128[1] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1];
        local_1bb8.m128[0] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0];
        local_1bb8._8_8_ =
             CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                      m128[3],left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[2]);
        aStack_1ba8._0_8_ =
             CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                      m128[1],left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                              field_0.m128[0]);
        aStack_1ba8._8_8_ =
             CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                      m128[3],left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                              field_0.m128[2]);
        local_1bf8._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1bf8._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = auStack_1b78._8_8_;
        auVar65 = vcmpps_avx(auVar73,auVar64,1);
        auVar67 = vinsertps_avx(auVar64,auVar73,0x50);
        auVar66 = vinsertps_avx(auVar73,auVar64,0x50);
        auVar65 = vblendvps_avx(auVar66,auVar67,auVar65);
        uVar6 = vmovlps_avx(auVar65);
        auStack_1b78._8_8_ = uVar6;
        local_1b08._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1b08._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[2]);
        uStack_1af8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                      field_0._0_8_;
        local_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[0]);
        uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[2]);
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ac8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ac0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ab8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ab0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        sStack_1a98 = right.num_time_segments;
        sStack_1a90 = right.max_num_time_segments;
        auStack_1a88._0_8_ = CONCAT44(right.max_time_range.upper,right.max_time_range.lower);
        auStack_1a88._8_8_ = SUB168(auStack_1a88,8);
        auVar74._8_8_ = 0;
        auVar74._0_8_ = auStack_1a88._8_8_;
        auVar65 = vcmpps_avx(auVar74,auVar64,1);
        auVar67 = vinsertps_avx(auVar64,auVar74,0x50);
        auVar66 = vinsertps_avx(auVar74,auVar64,0x50);
        auVar65 = vblendvps_avx(auVar66,auVar67,auVar65);
        uVar6 = vmovlps_avx(auVar65);
        auStack_1a88._0_8_ = SUB168(auStack_1a88,0);
        auStack_1a88._8_8_ = uVar6;
        local_1b98 = BVar9;
        local_1aa8 = sStack_1b90;
        sStack_1aa0 = sVar41;
        local_1a78 = local_1b68;
LAB_013f45fa:
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      }
      else {
        this_01 = &local_17b8 + uVar60 * 0xf;
        if (iVar7 != 2) {
          if (iVar7 == 1) {
            SetMB::deterministic_order((SetMB *)&this_01->field_1);
            splitFallback(this,(SetMB *)&this_01->field_1,(SetMB *)local_1bf8,
                          (SetMB *)&local_1b08.field_1);
          }
          else if (iVar7 == 3) {
            SetMB::deterministic_order((SetMB *)&this_01->field_1);
            splitByGeometry(this,(SetMB *)&this_01->field_1,(SetMB *)local_1bf8,
                            (SetMB *)&local_1b08.field_1);
          }
          goto LAB_013f45fa;
        }
        time_range1.lower = *(float *)((long)local_1718 + lVar35 + 8);
        time_range0.lower = local_1728[uVar60 * 0x1e + -1].lower;
        time_range1.upper = local_1728[uVar60 * 0x1e + -1].upper;
        BVar9 = local_1728[uVar60 * 0x1e];
        time_range0.upper = time_range1.lower;
        BVar37 = (BBox1f)operator_new(0x28);
        pMVar10 = (this->heuristicTemporalSplit).device;
        lVar36 = *(long *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8);
        *(MemoryMonitorInterface **)BVar37 = pMVar10;
        *(undefined1 *)((long)BVar37 + 8) = 0;
        *(long *)((long)BVar37 + 0x10) = 0;
        *(long *)((long)BVar37 + 0x18) = 0;
        *(long *)((long)BVar37 + 0x20) = 0;
        lVar36 = lVar36 - *(long *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8);
        if (lVar36 != 0) {
          uVar50 = lVar36 * 0x50;
          (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,uVar50,0);
          if (uVar50 < 0x1c00000) {
            pvVar38 = alignedMalloc(uVar50,0x10);
          }
          else {
            pvVar38 = os_malloc(uVar50,(bool *)((long)BVar37 + 8));
          }
          *(void **)((long)BVar37 + 0x20) = pvVar38;
          *(long *)((long)BVar37 + 0x10) = lVar36;
          *(long *)((long)BVar37 + 0x18) = lVar36;
        }
        pvVar31 = isLeft.vSplitPos;
        vSplitMask.field_0._0_4_ = BVar9.lower;
        vSplitMask.field_0._4_4_ = BVar9.upper;
        vSplitMask.field_0._8_8_ = &time_range0;
        pSVar11 = *(Split **)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8);
        pvVar12 = *(vint **)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8);
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        auVar65._8_4_ = 0x3f800000;
        auVar65._0_8_ = &DAT_3f8000003f800000;
        auVar65._12_4_ = 0x3f800000;
        uVar6 = vmovlps_avx(auVar65);
        right.max_time_range.upper = (float)uVar6;
        right.time_range.lower = (float)((ulong)uVar6 >> 0x20);
        right.time_range.upper = 0.0;
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )BVar37;
        if ((ulong)((long)pvVar12 - (long)pSVar11) < 0xc00) {
          isLeft.split = pSVar11;
          isLeft.vSplitPos = pvVar12;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    (&left,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
        }
        else {
          isLeft.vSplitPos._6_2_ = SUB82(pvVar31,6);
          isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
          tbb::detail::r1::initialize((task_group_context *)&isLeft);
          _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          vSplitPos.field_0.v[0] = (longlong)pvVar12;
          vSplitPos.field_0.v[1] = (longlong)pSVar11;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&left,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&isLeft,
                     (task_group_context *)
                     new_vector._M_t.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl);
          cVar34 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
          if (cVar34 != '\0') {
            prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar43,"task cancelled");
            __cxa_throw(prVar43,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&isLeft);
        }
        if (left.object_range._end - left.object_range._begin !=
            *(long *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8) -
            *(long *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8)) {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_8_ = &time_range0;
          left.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                         (*(PrimRefMB **)((long)BVar37 + 0x20),0,
                          *(long *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8) -
                          *(long *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8),0x400,
                          (anon_class_8_1_41ce32a5 *)&right);
        }
        uVar6 = vSplitPos.field_0.v[1];
        auVar66._4_4_ = time_range0.upper;
        auVar66._0_4_ = time_range0.lower;
        auVar66._8_8_ = 0;
        auStack_1be8._4_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[1];
        auStack_1be8._0_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[0];
        auStack_1be8._12_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[3];
        auStack_1be8._8_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[2];
        local_1bd8._4_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[1];
        local_1bd8._0_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[0];
        local_1bd8._12_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[3];
        local_1bd8._8_4_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[2];
        aStack_1bc8.m128[1] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             m128[1];
        aStack_1bc8.m128[0] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             m128[0];
        aStack_1bc8.m128[3] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             m128[3];
        aStack_1bc8.m128[2] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             m128[2];
        local_1bb8.m128[1] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1];
        local_1bb8.m128[0] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0];
        local_1bb8._8_8_ =
             CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                      m128[3],left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[2]);
        aStack_1ba8._0_8_ =
             CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                      m128[1],left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                              field_0.m128[0]);
        aStack_1ba8._8_8_ =
             CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                      m128[3],left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                              field_0.m128[2]);
        local_1bf8._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1bf8._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b98.lower = (float)(undefined4)left.object_range._begin;
        local_1b98.upper = (float)left.object_range._begin._4_4_;
        sStack_1b90 = left.object_range._end;
        auVar75._4_4_ = left.max_time_range.upper;
        auVar75._0_4_ = left.max_time_range.lower;
        auVar75._8_8_ = 0;
        auVar82._4_4_ = left.time_range.upper;
        auVar82._0_4_ = left.time_range.lower;
        auVar82._8_8_ = 0;
        auVar65 = vcmpps_avx(auVar82,auVar66,1);
        auVar67 = vinsertps_avx(auVar66,auVar82,0x50);
        auVar66 = vinsertps_avx(auVar82,auVar66,0x50);
        auVar65 = vblendvps_avx(auVar66,auVar67,auVar65);
        auStack_1b78 = vmovlhps_avx(auVar75,auVar65);
        pcVar13 = *(code **)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8);
        isLeft.split = (Split *)0x7f8000007f800000;
        isLeft.vSplitPos = (vint *)0x7f8000007f800000;
        isLeft.vSplitMask = (vbool *)0xff800000ff800000;
        auVar67._8_4_ = 0x3f800000;
        auVar67._0_8_ = &DAT_3f8000003f800000;
        auVar67._12_4_ = 0x3f800000;
        vmovlps_avx(auVar67);
        local_1b68 = BVar37;
        _reduction2 = BVar9;
        if ((ulong)((long)pcVar13 - *(long *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8)) < 0xc00) {
          vSplitPos.field_0.v[0] = *(long *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8);
          vSplitPos.field_0.v[1] = (longlong)pcVar13;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    (&right,(anon_class_24_3_35f68c7c *)&reduction2,
                     (range<unsigned_long> *)&vSplitPos);
        }
        else {
          vSplitPos.field_0.v[1]._4_1_ = 1;
          vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar6,6);
          vSplitPos.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
          local_19d8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_19d8._8_8_ = &reduction2;
          _reduction = pcVar13;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19d8,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos,
                     (task_group_context *)
                     new_vector._M_t.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl);
          cVar34 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
          if (cVar34 != '\0') {
            prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar43,"task cancelled");
            __cxa_throw(prVar43,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
        }
        lVar36 = right.object_range._end - right.object_range._begin;
        right.object_range._begin = *(unsigned_long *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8);
        right.object_range._end = lVar36 + right.object_range._begin;
        if (lVar36 != *(unsigned_long *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8) -
                      right.object_range._begin) {
          isLeft.split = (Split *)&time_range1;
          right.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                         (*(PrimRefMB **)((long)BVar9 + 0x20),right.object_range._begin,
                          *(unsigned_long *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8),0x400,
                          (anon_class_8_1_41ce32a6 *)&isLeft);
        }
        auVar68._4_4_ = time_range1.upper;
        auVar68._0_4_ = time_range1.lower;
        auVar68._8_8_ = 0;
        local_1b08._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1b08._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        uStack_1af8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                      field_0._0_8_;
        uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[2]);
        local_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[0]);
        uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[2]);
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ac8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ac0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ab8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ab0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        sStack_1a90 = right.max_num_time_segments;
        sStack_1a98 = right.num_time_segments;
        local_1aa8 = right.object_range._begin;
        sStack_1aa0 = right.object_range._end;
        auVar76._4_4_ = right.time_range.upper;
        auVar76._0_4_ = right.time_range.lower;
        auVar76._8_8_ = 0;
        auVar65 = vcmpps_avx(auVar76,auVar68,1);
        auVar67 = vinsertps_avx(auVar68,auVar76,0x50);
        auVar66 = vinsertps_avx(auVar76,auVar68,0x50);
        auVar65 = vblendvps_avx(auVar66,auVar67,auVar65);
        auVar77._4_4_ = right.max_time_range.upper;
        auVar77._0_4_ = right.max_time_range.lower;
        auVar77._8_8_ = 0;
        auStack_1a88 = vmovlhps_avx(auVar77,auVar65);
        local_1a78 = BVar9;
      }
      bVar62 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      findFallback((Split *)&left,this,(SetMB *)local_1bf8);
      local_1b58 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_;
      uStack_1b50 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._8_8_;
      local_1b48 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                            upper.field_0.m128[1],
                            left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                            upper.field_0.m128[0]);
      local_1b38 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[1],
                            left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[0]);
      uStack_1b30 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                             lower.field_0.m128[3],
                             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                             lower.field_0.m128[2]);
      uStack_1b28 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                             upper.field_0.m128[1],
                             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                             upper.field_0.m128[0]);
      uStack_1b20 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                             upper.field_0.m128[3],
                             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                             upper.field_0.m128[2]);
      findFallback((Split *)&left,this,(SetMB *)&local_1b08.field_1);
      lVar36 = local_640;
      local_1a58 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                            upper.field_0.m128[1],
                            left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                            upper.field_0.m128[0]);
      local_1a48 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[1],
                            left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[0]);
      uStack_1a40 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                             lower.field_0.m128[3],
                             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                             lower.field_0.m128[2]);
      uStack_1a38 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                             upper.field_0.m128[1],
                             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                             upper.field_0.m128[0]);
      uStack_1a30 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                             upper.field_0.m128[3],
                             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                             upper.field_0.m128[2]);
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar44 = local_8c8[uVar60];
      if (local_1b68 == *pBVar44) {
        pBVar44[1] = (BBox1f)((long)pBVar44[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar36 * 2 + -1] = local_1b68;
        local_838[lVar36 * 2].lower = 1.4013e-45;
        local_838[lVar36 * 2].upper = 0.0;
        local_8c8[uVar60] = local_838 + lVar36 * 2 + -1;
      }
      lVar36 = local_640;
      if (local_1a78 == *pBVar44) {
        local_8c8[local_848] = pBVar44;
        pBVar44[1] = (BBox1f)((long)pBVar44[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar36 * 2 + -1] = local_1a78;
        local_838[lVar36 * 2].lower = 1.4013e-45;
        local_838[lVar36 * 2].upper = 0.0;
        local_8c8[local_848] = local_838 + lVar36 * 2 + -1;
      }
      pBVar16 = pBVar44 + 1;
      *pBVar16 = (BBox1f)((long)*pBVar16 + -1);
      if ((*pBVar16 == (BBox1f)0x0) && (BVar9 = *pBVar44, BVar9 != (BBox1f)0x0)) {
        lVar36 = *(long *)((long)BVar9 + 0x18);
        pvVar38 = *(void **)((long)BVar9 + 0x20);
        if (pvVar38 != (void *)0x0) {
          if ((ulong)(lVar36 * 0x50) < 0x1c00000) {
            alignedFree(pvVar38);
          }
          else {
            os_free(pvVar38,lVar36 * 0x50,*(bool *)((long)BVar9 + 8));
          }
        }
        if (lVar36 != 0) {
          (**(code **)**(undefined8 **)BVar9)(*(undefined8 **)BVar9,lVar36 * -0x50,1);
        }
        *(undefined8 *)((long)BVar9 + 0x10) = 0;
        *(undefined8 *)((long)BVar9 + 0x18) = 0;
        *(undefined8 *)((long)BVar9 + 0x20) = 0;
        operator_delete((void *)BVar9);
      }
      uVar50 = local_848;
      auVar67 = auStack_1a88;
      auVar65 = auStack_1b78;
      (&v0)[uVar60 * 0xf].field_0.v[0] = v2.field_0.v[0];
      *(undefined8 *)(&local_17b8 + uVar60 * 0xf) = local_1bf8._0_8_;
      *(undefined8 *)(local_17a8 + uVar60 * 0xf0 + -8) = local_1bf8._8_8_;
      ((BBox1f *)(local_17a8 + uVar60 * 0xf0))->lower = (float)auStack_1be8._0_4_;
      ((BBox1f *)(local_17a8 + uVar60 * 0xf0))->upper = (float)auStack_1be8._4_4_;
      ((BBox1f *)(auStack_1798 + lVar35 + -8))->lower = (float)auStack_1be8._8_4_;
      ((BBox1f *)(auStack_1798 + lVar35 + -8))->upper = (float)auStack_1be8._12_4_;
      ((BBox1f *)(auStack_1798 + lVar35))->lower = (float)local_1bd8._0_4_;
      ((BBox1f *)(auStack_1798 + lVar35))->upper = (float)local_1bd8._4_4_;
      ((BBox1f *)(auStack_1798 + lVar35 + 8))->lower = (float)local_1bd8._8_4_;
      ((BBox1f *)(auStack_1798 + lVar35 + 8))->upper = (float)local_1bd8._12_4_;
      ((BBox1f *)(local_1788 + uVar60 * 0xf0))->lower = (float)aStack_1bc8._0_4_;
      ((BBox1f *)(local_1788 + uVar60 * 0xf0))->upper = aStack_1bc8.m128[1];
      ((BBox1f *)(local_1788 + lVar35 + 8))->lower = (float)aStack_1bc8._8_4_;
      ((BBox1f *)(local_1788 + lVar35 + 8))->upper = aStack_1bc8.m128[3];
      *(undefined8 *)(&local_1778 + uVar60 * 0xf) = local_1bb8._0_8_;
      *(undefined8 *)((long)&local_1778 + lVar35 + 8) = local_1bb8._8_8_;
      *(undefined8 *)(local_1768 + uVar60 * 0xf0) = aStack_1ba8._0_8_;
      *(undefined8 *)(local_1768 + uVar60 * 0xf0 + 8) = aStack_1ba8._8_8_;
      *(BBox1f *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8) = local_1b98;
      *(size_t *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8) = sStack_1b90;
      asStack_1748[uVar60 * 0x1e] = sStack_1b88;
      asStack_1748[uVar60 * 0x1e + 1] = sStack_1b80;
      (&local_1738)[uVar60 * 0x1e].lower = (float)auStack_1b78._0_4_;
      (&local_1738)[uVar60 * 0x1e].upper = (float)auStack_1b78._4_4_;
      local_1728[uVar60 * 0x1e + -1].lower = (float)auStack_1b78._8_4_;
      local_1728[uVar60 * 0x1e + -1].upper = (float)auStack_1b78._12_4_;
      local_1728[uVar60 * 0x1e] = local_1b68;
      pSVar2->sah = (float)(undefined4)local_1b58;
      pSVar2->dim = local_1b58._4_4_;
      *(undefined8 *)((long)local_1718 + lVar35 + 8) = uStack_1b50;
      *(undefined8 *)((long)local_1718 + lVar35 + 0x10) = local_1b48;
      *(undefined8 *)((long)local_1718 + lVar35 + 0x20) = local_1b38;
      *(undefined8 *)((long)local_1718 + lVar35 + 0x28) = uStack_1b30;
      *(undefined8 *)((long)local_1718 + lVar35 + 0x30) = uStack_1b28;
      *(undefined8 *)((long)local_1718 + lVar35 + 0x38) = uStack_1b20;
      lVar35 = local_848 * 0xf0;
      (&v0)[local_848 * 0xf].field_0.v[0] = geomID.field_0.v[0];
      *(undefined8 *)(&local_17b8 + uVar50 * 0xf) = local_1b08._0_8_;
      *(undefined8 *)(local_17a8 + uVar50 * 0xf0 + -8) = local_1b08._8_8_;
      *(undefined8 *)(local_17a8 + uVar50 * 0xf0) = uStack_1af8;
      *(undefined8 *)(auStack_1798 + lVar35 + -8) = uStack_1af0;
      *(undefined8 *)(auStack_1798 + lVar35) = local_1ae8;
      *(undefined8 *)(auStack_1798 + lVar35 + 8) = uStack_1ae0;
      *(undefined8 *)(local_1788 + uVar50 * 0xf0) = uStack_1ad8;
      *(undefined8 *)(local_1788 + lVar35 + 8) = uStack_1ad0;
      *(undefined8 *)(&local_1778 + uVar50 * 0xf) = local_1ac8;
      *(undefined8 *)((long)&local_1778 + lVar35 + 8) = uStack_1ac0;
      *(undefined8 *)(local_1768 + uVar50 * 0xf0) = uStack_1ab8;
      *(undefined8 *)(local_1768 + uVar50 * 0xf0 + 8) = uStack_1ab0;
      *(size_t *)(local_1768 + (uVar50 * 0x1e + 1) * 8 + 8) = local_1aa8;
      *(size_t *)(local_1768 + (uVar50 * 0x1e + 2) * 8 + 8) = sStack_1aa0;
      asStack_1748[uVar50 * 0x1e] = sStack_1a98;
      asStack_1748[uVar50 * 0x1e + 1] = sStack_1a90;
      (&local_1738)[uVar50 * 0x1e].lower = (float)auStack_1a88._0_4_;
      (&local_1738)[uVar50 * 0x1e].upper = (float)auStack_1a88._4_4_;
      local_1728[uVar50 * 0x1e + -1].lower = (float)auStack_1a88._8_4_;
      local_1728[uVar50 * 0x1e + -1].upper = (float)auStack_1a88._12_4_;
      local_1728[uVar50 * 0x1e] = local_1a78;
      *(undefined8 *)((long)local_1718 + lVar35) = local_1a68;
      *(undefined8 *)((long)local_1718 + lVar35 + 8) = uStack_1a60;
      *(undefined8 *)((long)local_1718 + lVar35 + 0x10) = local_1a58;
      *(undefined8 *)((long)local_1718 + lVar35 + 0x20) = local_1a48;
      *(undefined8 *)((long)local_1718 + lVar35 + 0x28) = uStack_1a40;
      *(undefined8 *)((long)local_1718 + lVar35 + 0x30) = uStack_1a38;
      *(undefined8 *)((long)local_1718 + lVar35 + 0x38) = uStack_1a30;
      local_848 = local_848 + 1;
      auStack_1b78 = auVar65;
      auStack_1a88 = auVar67;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      bVar33 = bVar33 | bVar62;
    }
  } while ((uVar60 != 0xffffffffffffffff) && (local_848 < (this->cfg).branchingFactor));
  if (local_848 != 0) {
    puVar45 = &uStack_172c;
    uVar39 = local_848;
    do {
      auVar65 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416(puVar45[-1]),1);
      auVar67 = vcmpps_avx(ZEXT416(*puVar45),
                           ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
      auVar65 = vorps_avx(auVar65,auVar67);
      bVar33 = bVar33 | auVar65[0];
      puVar45 = puVar45 + 0x3c;
      uVar39 = uVar39 - 1;
    } while (uVar39 != 0);
  }
  if ((bVar33 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0x1c0;
    pTVar14 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar14->alloc)._M_b._M_p) {
      geomID.field_0.v[1]._0_1_ = 1;
      geomID.field_0.v[0] = (longlong)pTVar14;
      MutexSys::lock(&pTVar14->mutex);
      if ((pTVar14->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar14->alloc1).bytesUsed + (pTVar14->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar14->alloc0).end + (pTVar14->alloc1).end) -
             ((pTVar14->alloc0).cur + (pTVar14->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar14->alloc1).bytesWasted + (pTVar14->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar72 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar14->alloc0).end = auVar72._0_8_;
      (pTVar14->alloc0).allocBlockSize = auVar72._8_8_;
      (pTVar14->alloc0).bytesUsed = auVar72._16_8_;
      (pTVar14->alloc0).bytesWasted = auVar72._24_8_;
      (pTVar14->alloc0).ptr = (char *)auVar72._0_8_;
      (pTVar14->alloc0).cur = auVar72._8_8_;
      (pTVar14->alloc0).end = auVar72._16_8_;
      (pTVar14->alloc0).allocBlockSize = auVar72._24_8_;
      auVar72 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar14->alloc1).end = auVar72._0_8_;
        (pTVar14->alloc1).allocBlockSize = auVar72._8_8_;
        (pTVar14->alloc1).bytesUsed = auVar72._16_8_;
        (pTVar14->alloc1).bytesWasted = auVar72._24_8_;
        (pTVar14->alloc1).ptr = (char *)auVar72._0_8_;
        (pTVar14->alloc1).cur = auVar72._8_8_;
        (pTVar14->alloc1).end = auVar72._16_8_;
        (pTVar14->alloc1).allocBlockSize = auVar72._24_8_;
      }
      else {
        (pTVar14->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar14->alloc1).ptr = (char *)auVar72._0_8_;
        (pTVar14->alloc1).cur = auVar72._8_8_;
        (pTVar14->alloc1).end = auVar72._16_8_;
        (pTVar14->alloc1).allocBlockSize = auVar72._24_8_;
        (pTVar14->alloc1).end = auVar72._0_8_;
        (pTVar14->alloc1).allocBlockSize = auVar72._8_8_;
        (pTVar14->alloc1).bytesUsed = auVar72._16_8_;
        (pTVar14->alloc1).bytesWasted = auVar72._24_8_;
        (pTVar14->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar14->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           pTVar14;
      v2.field_0.v[1]._0_1_ = 1;
      v2.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar15._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar15._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar15,(ThreadLocal2 **)&left);
      }
      else {
        *iVar15._M_current =
             (ThreadLocal2 *)
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        pppTVar4 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar4 = *pppTVar4 + 1;
      }
      if (v2.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)v2.field_0.v[0]);
      }
      if (geomID.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)geomID.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar41 = (alloc.talloc0)->cur;
    uVar39 = (ulong)(-(int)sVar41 & 0x1f);
    uVar60 = sVar41 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar39;
    (alloc.talloc0)->cur = uVar60;
    if ((alloc.talloc0)->end < uVar60) {
      (alloc.talloc0)->cur = sVar41;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
        (alloc.talloc0)->ptr = pcVar49;
        sVar41 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar41;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = v2.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v2.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
          pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
          (alloc.talloc0)->ptr = pcVar49;
          sVar41 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar41;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = v2.field_0.v[0];
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)v2.field_0.v[0] <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar49 = (char *)0x0;
            goto LAB_013f5770;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar41;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar39;
      pcVar49 = (alloc.talloc0)->ptr +
                (uVar60 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_013f5770:
    pcVar49[0xc0] = '\0';
    pcVar49[0xc1] = '\0';
    pcVar49[0xc2] = -0x80;
    pcVar49[0xc3] = '\x7f';
    pcVar49[0xc4] = '\0';
    pcVar49[0xc5] = '\0';
    pcVar49[0xc6] = -0x80;
    pcVar49[199] = '\x7f';
    pcVar49[200] = '\0';
    pcVar49[0xc9] = '\0';
    pcVar49[0xca] = -0x80;
    pcVar49[0xcb] = '\x7f';
    pcVar49[0xcc] = '\0';
    pcVar49[0xcd] = '\0';
    pcVar49[0xce] = -0x80;
    pcVar49[0xcf] = '\x7f';
    pcVar49[0xd0] = '\0';
    pcVar49[0xd1] = '\0';
    pcVar49[0xd2] = -0x80;
    pcVar49[0xd3] = '\x7f';
    pcVar49[0xd4] = '\0';
    pcVar49[0xd5] = '\0';
    pcVar49[0xd6] = -0x80;
    pcVar49[0xd7] = '\x7f';
    pcVar49[0xd8] = '\0';
    pcVar49[0xd9] = '\0';
    pcVar49[0xda] = -0x80;
    pcVar49[0xdb] = '\x7f';
    pcVar49[0xdc] = '\0';
    pcVar49[0xdd] = '\0';
    pcVar49[0xde] = -0x80;
    pcVar49[0xdf] = '\x7f';
    pcVar49[0x80] = '\0';
    pcVar49[0x81] = '\0';
    pcVar49[0x82] = -0x80;
    pcVar49[0x83] = '\x7f';
    pcVar49[0x84] = '\0';
    pcVar49[0x85] = '\0';
    pcVar49[0x86] = -0x80;
    pcVar49[0x87] = '\x7f';
    pcVar49[0x88] = '\0';
    pcVar49[0x89] = '\0';
    pcVar49[0x8a] = -0x80;
    pcVar49[0x8b] = '\x7f';
    pcVar49[0x8c] = '\0';
    pcVar49[0x8d] = '\0';
    pcVar49[0x8e] = -0x80;
    pcVar49[0x8f] = '\x7f';
    pcVar49[0x90] = '\0';
    pcVar49[0x91] = '\0';
    pcVar49[0x92] = -0x80;
    pcVar49[0x93] = '\x7f';
    pcVar49[0x94] = '\0';
    pcVar49[0x95] = '\0';
    pcVar49[0x96] = -0x80;
    pcVar49[0x97] = '\x7f';
    pcVar49[0x98] = '\0';
    pcVar49[0x99] = '\0';
    pcVar49[0x9a] = -0x80;
    pcVar49[0x9b] = '\x7f';
    pcVar49[0x9c] = '\0';
    pcVar49[0x9d] = '\0';
    pcVar49[0x9e] = -0x80;
    pcVar49[0x9f] = '\x7f';
    pcVar49[0x40] = '\0';
    pcVar49[0x41] = '\0';
    pcVar49[0x42] = -0x80;
    pcVar49[0x43] = '\x7f';
    pcVar49[0x44] = '\0';
    pcVar49[0x45] = '\0';
    pcVar49[0x46] = -0x80;
    pcVar49[0x47] = '\x7f';
    pcVar49[0x48] = '\0';
    pcVar49[0x49] = '\0';
    pcVar49[0x4a] = -0x80;
    pcVar49[0x4b] = '\x7f';
    pcVar49[0x4c] = '\0';
    pcVar49[0x4d] = '\0';
    pcVar49[0x4e] = -0x80;
    pcVar49[0x4f] = '\x7f';
    pcVar49[0x50] = '\0';
    pcVar49[0x51] = '\0';
    pcVar49[0x52] = -0x80;
    pcVar49[0x53] = '\x7f';
    pcVar49[0x54] = '\0';
    pcVar49[0x55] = '\0';
    pcVar49[0x56] = -0x80;
    pcVar49[0x57] = '\x7f';
    pcVar49[0x58] = '\0';
    pcVar49[0x59] = '\0';
    pcVar49[0x5a] = -0x80;
    pcVar49[0x5b] = '\x7f';
    pcVar49[0x5c] = '\0';
    pcVar49[0x5d] = '\0';
    pcVar49[0x5e] = -0x80;
    pcVar49[0x5f] = '\x7f';
    pcVar49[0xe0] = '\0';
    pcVar49[0xe1] = '\0';
    pcVar49[0xe2] = -0x80;
    pcVar49[0xe3] = -1;
    pcVar49[0xe4] = '\0';
    pcVar49[0xe5] = '\0';
    pcVar49[0xe6] = -0x80;
    pcVar49[0xe7] = -1;
    pcVar49[0xe8] = '\0';
    pcVar49[0xe9] = '\0';
    pcVar49[0xea] = -0x80;
    pcVar49[0xeb] = -1;
    pcVar49[0xec] = '\0';
    pcVar49[0xed] = '\0';
    pcVar49[0xee] = -0x80;
    pcVar49[0xef] = -1;
    pcVar49[0xf0] = '\0';
    pcVar49[0xf1] = '\0';
    pcVar49[0xf2] = -0x80;
    pcVar49[0xf3] = -1;
    pcVar49[0xf4] = '\0';
    pcVar49[0xf5] = '\0';
    pcVar49[0xf6] = -0x80;
    pcVar49[0xf7] = -1;
    pcVar49[0xf8] = '\0';
    pcVar49[0xf9] = '\0';
    pcVar49[0xfa] = -0x80;
    pcVar49[0xfb] = -1;
    pcVar49[0xfc] = '\0';
    pcVar49[0xfd] = '\0';
    pcVar49[0xfe] = -0x80;
    pcVar49[0xff] = -1;
    pcVar49[0xa0] = '\0';
    pcVar49[0xa1] = '\0';
    pcVar49[0xa2] = -0x80;
    pcVar49[0xa3] = -1;
    pcVar49[0xa4] = '\0';
    pcVar49[0xa5] = '\0';
    pcVar49[0xa6] = -0x80;
    pcVar49[0xa7] = -1;
    pcVar49[0xa8] = '\0';
    pcVar49[0xa9] = '\0';
    pcVar49[0xaa] = -0x80;
    pcVar49[0xab] = -1;
    pcVar49[0xac] = '\0';
    pcVar49[0xad] = '\0';
    pcVar49[0xae] = -0x80;
    pcVar49[0xaf] = -1;
    pcVar49[0xb0] = '\0';
    pcVar49[0xb1] = '\0';
    pcVar49[0xb2] = -0x80;
    pcVar49[0xb3] = -1;
    pcVar49[0xb4] = '\0';
    pcVar49[0xb5] = '\0';
    pcVar49[0xb6] = -0x80;
    pcVar49[0xb7] = -1;
    pcVar49[0xb8] = '\0';
    pcVar49[0xb9] = '\0';
    pcVar49[0xba] = -0x80;
    pcVar49[0xbb] = -1;
    pcVar49[0xbc] = '\0';
    pcVar49[0xbd] = '\0';
    pcVar49[0xbe] = -0x80;
    pcVar49[0xbf] = -1;
    pcVar49[0x60] = '\0';
    pcVar49[0x61] = '\0';
    pcVar49[0x62] = -0x80;
    pcVar49[99] = -1;
    pcVar49[100] = '\0';
    pcVar49[0x65] = '\0';
    pcVar49[0x66] = -0x80;
    pcVar49[0x67] = -1;
    pcVar49[0x68] = '\0';
    pcVar49[0x69] = '\0';
    pcVar49[0x6a] = -0x80;
    pcVar49[0x6b] = -1;
    pcVar49[0x6c] = '\0';
    pcVar49[0x6d] = '\0';
    pcVar49[0x6e] = -0x80;
    pcVar49[0x6f] = -1;
    pcVar49[0x70] = '\0';
    pcVar49[0x71] = '\0';
    pcVar49[0x72] = -0x80;
    pcVar49[0x73] = -1;
    pcVar49[0x74] = '\0';
    pcVar49[0x75] = '\0';
    pcVar49[0x76] = -0x80;
    pcVar49[0x77] = -1;
    pcVar49[0x78] = '\0';
    pcVar49[0x79] = '\0';
    pcVar49[0x7a] = -0x80;
    pcVar49[0x7b] = -1;
    pcVar49[0x7c] = '\0';
    pcVar49[0x7d] = '\0';
    pcVar49[0x7e] = -0x80;
    pcVar49[0x7f] = -1;
    auVar72 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar49 + 0x100) = auVar72;
    *(undefined1 (*) [32])(pcVar49 + 0x120) = auVar72;
    auVar72 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar49 + 0x140) = auVar72;
    *(undefined1 (*) [32])(pcVar49 + 0x160) = auVar72;
    *(undefined1 (*) [32])(pcVar49 + 0x180) = auVar72;
    *(undefined1 (*) [32])(pcVar49 + 0x1a0) = auVar72;
    lVar35 = 0;
    do {
      pcVar3 = pcVar49 + lVar35 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      pcVar3[8] = '\b';
      pcVar3[9] = '\0';
      pcVar3[10] = '\0';
      pcVar3[0xb] = '\0';
      pcVar3[0xc] = '\0';
      pcVar3[0xd] = '\0';
      pcVar3[0xe] = '\0';
      pcVar3[0xf] = '\0';
      pcVar3[0x10] = '\b';
      pcVar3[0x11] = '\0';
      pcVar3[0x12] = '\0';
      pcVar3[0x13] = '\0';
      pcVar3[0x14] = '\0';
      pcVar3[0x15] = '\0';
      pcVar3[0x16] = '\0';
      pcVar3[0x17] = '\0';
      pcVar3[0x18] = '\b';
      pcVar3[0x19] = '\0';
      pcVar3[0x1a] = '\0';
      pcVar3[0x1b] = '\0';
      pcVar3[0x1c] = '\0';
      pcVar3[0x1d] = '\0';
      pcVar3[0x1e] = '\0';
      pcVar3[0x1f] = '\0';
      lVar35 = lVar35 + 4;
    } while (lVar35 != 8);
    uVar39 = 1;
    goto LAB_013f5800;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x200;
  pTVar14 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar14->alloc)._M_b._M_p) {
    geomID.field_0.v[1]._0_1_ = 1;
    geomID.field_0.v[0] = (longlong)pTVar14;
    MutexSys::lock(&pTVar14->mutex);
    if ((pTVar14->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar14->alloc1).bytesUsed + (pTVar14->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar14->alloc0).end + (pTVar14->alloc1).end) -
           ((pTVar14->alloc0).cur + (pTVar14->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar14->alloc1).bytesWasted + (pTVar14->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar72 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar14->alloc0).end = auVar72._0_8_;
    (pTVar14->alloc0).allocBlockSize = auVar72._8_8_;
    (pTVar14->alloc0).bytesUsed = auVar72._16_8_;
    (pTVar14->alloc0).bytesWasted = auVar72._24_8_;
    (pTVar14->alloc0).ptr = (char *)auVar72._0_8_;
    (pTVar14->alloc0).cur = auVar72._8_8_;
    (pTVar14->alloc0).end = auVar72._16_8_;
    (pTVar14->alloc0).allocBlockSize = auVar72._24_8_;
    auVar72 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar14->alloc1).end = auVar72._0_8_;
      (pTVar14->alloc1).allocBlockSize = auVar72._8_8_;
      (pTVar14->alloc1).bytesUsed = auVar72._16_8_;
      (pTVar14->alloc1).bytesWasted = auVar72._24_8_;
      (pTVar14->alloc1).ptr = (char *)auVar72._0_8_;
      (pTVar14->alloc1).cur = auVar72._8_8_;
      (pTVar14->alloc1).end = auVar72._16_8_;
      (pTVar14->alloc1).allocBlockSize = auVar72._24_8_;
    }
    else {
      (pTVar14->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar14->alloc1).ptr = (char *)auVar72._0_8_;
      (pTVar14->alloc1).cur = auVar72._8_8_;
      (pTVar14->alloc1).end = auVar72._16_8_;
      (pTVar14->alloc1).allocBlockSize = auVar72._24_8_;
      (pTVar14->alloc1).end = auVar72._0_8_;
      (pTVar14->alloc1).allocBlockSize = auVar72._8_8_;
      (pTVar14->alloc1).bytesUsed = auVar72._16_8_;
      (pTVar14->alloc1).bytesWasted = auVar72._24_8_;
      (pTVar14->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar14->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         pTVar14;
    v2.field_0.v[1]._0_1_ = 1;
    v2.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar15._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar15._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar15,(ThreadLocal2 **)&left);
    }
    else {
      *iVar15._M_current =
           (ThreadLocal2 *)
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      pppTVar4 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar4 = *pppTVar4 + 1;
    }
    if (v2.field_0.v[1]._0_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)v2.field_0.v[0]);
    }
    if (geomID.field_0.v[1]._0_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)geomID.field_0.v[0]);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar41 = (alloc.talloc0)->cur;
  uVar39 = (ulong)(-(int)sVar41 & 0x1f);
  uVar60 = sVar41 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar39;
  (alloc.talloc0)->cur = uVar60;
  if ((alloc.talloc0)->end < uVar60) {
    (alloc.talloc0)->cur = sVar41;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
      pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
      (alloc.talloc0)->ptr = pcVar49;
      sVar41 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar41;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = v2.field_0.v[0];
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)v2.field_0.v[0] <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
        (alloc.talloc0)->ptr = pcVar49;
        sVar41 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar41;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = v2.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v2.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar49 = (char *)0x0;
          goto LAB_013f5651;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar41;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar39;
    pcVar49 = (alloc.talloc0)->ptr +
              (uVar60 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_013f5651:
  pcVar49[0x1c0] = '\0';
  pcVar49[0x1c1] = '\0';
  pcVar49[0x1c2] = -0x80;
  pcVar49[0x1c3] = '\x7f';
  pcVar49[0x1c4] = '\0';
  pcVar49[0x1c5] = '\0';
  pcVar49[0x1c6] = -0x80;
  pcVar49[0x1c7] = '\x7f';
  pcVar49[0x1c8] = '\0';
  pcVar49[0x1c9] = '\0';
  pcVar49[0x1ca] = -0x80;
  pcVar49[0x1cb] = '\x7f';
  pcVar49[0x1cc] = '\0';
  pcVar49[0x1cd] = '\0';
  pcVar49[0x1ce] = -0x80;
  pcVar49[0x1cf] = '\x7f';
  pcVar49[0x1d0] = '\0';
  pcVar49[0x1d1] = '\0';
  pcVar49[0x1d2] = -0x80;
  pcVar49[0x1d3] = '\x7f';
  pcVar49[0x1d4] = '\0';
  pcVar49[0x1d5] = '\0';
  pcVar49[0x1d6] = -0x80;
  pcVar49[0x1d7] = '\x7f';
  pcVar49[0x1d8] = '\0';
  pcVar49[0x1d9] = '\0';
  pcVar49[0x1da] = -0x80;
  pcVar49[0x1db] = '\x7f';
  pcVar49[0x1dc] = '\0';
  pcVar49[0x1dd] = '\0';
  pcVar49[0x1de] = -0x80;
  pcVar49[0x1df] = '\x7f';
  pcVar49[0x1e0] = '\0';
  pcVar49[0x1e1] = '\0';
  pcVar49[0x1e2] = -0x80;
  pcVar49[0x1e3] = -1;
  pcVar49[0x1e4] = '\0';
  pcVar49[0x1e5] = '\0';
  pcVar49[0x1e6] = -0x80;
  pcVar49[0x1e7] = -1;
  pcVar49[0x1e8] = '\0';
  pcVar49[0x1e9] = '\0';
  pcVar49[0x1ea] = -0x80;
  pcVar49[0x1eb] = -1;
  pcVar49[0x1ec] = '\0';
  pcVar49[0x1ed] = '\0';
  pcVar49[0x1ee] = -0x80;
  pcVar49[0x1ef] = -1;
  pcVar49[0x1f0] = '\0';
  pcVar49[0x1f1] = '\0';
  pcVar49[0x1f2] = -0x80;
  pcVar49[499] = -1;
  pcVar49[500] = '\0';
  pcVar49[0x1f5] = '\0';
  pcVar49[0x1f6] = -0x80;
  pcVar49[0x1f7] = -1;
  pcVar49[0x1f8] = '\0';
  pcVar49[0x1f9] = '\0';
  pcVar49[0x1fa] = -0x80;
  pcVar49[0x1fb] = -1;
  pcVar49[0x1fc] = '\0';
  pcVar49[0x1fd] = '\0';
  pcVar49[0x1fe] = -0x80;
  pcVar49[0x1ff] = -1;
  pcVar49[0xc0] = '\0';
  pcVar49[0xc1] = '\0';
  pcVar49[0xc2] = -0x80;
  pcVar49[0xc3] = '\x7f';
  pcVar49[0xc4] = '\0';
  pcVar49[0xc5] = '\0';
  pcVar49[0xc6] = -0x80;
  pcVar49[199] = '\x7f';
  pcVar49[200] = '\0';
  pcVar49[0xc9] = '\0';
  pcVar49[0xca] = -0x80;
  pcVar49[0xcb] = '\x7f';
  pcVar49[0xcc] = '\0';
  pcVar49[0xcd] = '\0';
  pcVar49[0xce] = -0x80;
  pcVar49[0xcf] = '\x7f';
  pcVar49[0xd0] = '\0';
  pcVar49[0xd1] = '\0';
  pcVar49[0xd2] = -0x80;
  pcVar49[0xd3] = '\x7f';
  pcVar49[0xd4] = '\0';
  pcVar49[0xd5] = '\0';
  pcVar49[0xd6] = -0x80;
  pcVar49[0xd7] = '\x7f';
  pcVar49[0xd8] = '\0';
  pcVar49[0xd9] = '\0';
  pcVar49[0xda] = -0x80;
  pcVar49[0xdb] = '\x7f';
  pcVar49[0xdc] = '\0';
  pcVar49[0xdd] = '\0';
  pcVar49[0xde] = -0x80;
  pcVar49[0xdf] = '\x7f';
  pcVar49[0x80] = '\0';
  pcVar49[0x81] = '\0';
  pcVar49[0x82] = -0x80;
  pcVar49[0x83] = '\x7f';
  pcVar49[0x84] = '\0';
  pcVar49[0x85] = '\0';
  pcVar49[0x86] = -0x80;
  pcVar49[0x87] = '\x7f';
  pcVar49[0x88] = '\0';
  pcVar49[0x89] = '\0';
  pcVar49[0x8a] = -0x80;
  pcVar49[0x8b] = '\x7f';
  pcVar49[0x8c] = '\0';
  pcVar49[0x8d] = '\0';
  pcVar49[0x8e] = -0x80;
  pcVar49[0x8f] = '\x7f';
  pcVar49[0x90] = '\0';
  pcVar49[0x91] = '\0';
  pcVar49[0x92] = -0x80;
  pcVar49[0x93] = '\x7f';
  pcVar49[0x94] = '\0';
  pcVar49[0x95] = '\0';
  pcVar49[0x96] = -0x80;
  pcVar49[0x97] = '\x7f';
  pcVar49[0x98] = '\0';
  pcVar49[0x99] = '\0';
  pcVar49[0x9a] = -0x80;
  pcVar49[0x9b] = '\x7f';
  pcVar49[0x9c] = '\0';
  pcVar49[0x9d] = '\0';
  pcVar49[0x9e] = -0x80;
  pcVar49[0x9f] = '\x7f';
  pcVar49[0x40] = '\0';
  pcVar49[0x41] = '\0';
  pcVar49[0x42] = -0x80;
  pcVar49[0x43] = '\x7f';
  pcVar49[0x44] = '\0';
  pcVar49[0x45] = '\0';
  pcVar49[0x46] = -0x80;
  pcVar49[0x47] = '\x7f';
  pcVar49[0x48] = '\0';
  pcVar49[0x49] = '\0';
  pcVar49[0x4a] = -0x80;
  pcVar49[0x4b] = '\x7f';
  pcVar49[0x4c] = '\0';
  pcVar49[0x4d] = '\0';
  pcVar49[0x4e] = -0x80;
  pcVar49[0x4f] = '\x7f';
  pcVar49[0x50] = '\0';
  pcVar49[0x51] = '\0';
  pcVar49[0x52] = -0x80;
  pcVar49[0x53] = '\x7f';
  pcVar49[0x54] = '\0';
  pcVar49[0x55] = '\0';
  pcVar49[0x56] = -0x80;
  pcVar49[0x57] = '\x7f';
  pcVar49[0x58] = '\0';
  pcVar49[0x59] = '\0';
  pcVar49[0x5a] = -0x80;
  pcVar49[0x5b] = '\x7f';
  pcVar49[0x5c] = '\0';
  pcVar49[0x5d] = '\0';
  pcVar49[0x5e] = -0x80;
  pcVar49[0x5f] = '\x7f';
  pcVar49[0xe0] = '\0';
  pcVar49[0xe1] = '\0';
  pcVar49[0xe2] = -0x80;
  pcVar49[0xe3] = -1;
  pcVar49[0xe4] = '\0';
  pcVar49[0xe5] = '\0';
  pcVar49[0xe6] = -0x80;
  pcVar49[0xe7] = -1;
  pcVar49[0xe8] = '\0';
  pcVar49[0xe9] = '\0';
  pcVar49[0xea] = -0x80;
  pcVar49[0xeb] = -1;
  pcVar49[0xec] = '\0';
  pcVar49[0xed] = '\0';
  pcVar49[0xee] = -0x80;
  pcVar49[0xef] = -1;
  pcVar49[0xf0] = '\0';
  pcVar49[0xf1] = '\0';
  pcVar49[0xf2] = -0x80;
  pcVar49[0xf3] = -1;
  pcVar49[0xf4] = '\0';
  pcVar49[0xf5] = '\0';
  pcVar49[0xf6] = -0x80;
  pcVar49[0xf7] = -1;
  pcVar49[0xf8] = '\0';
  pcVar49[0xf9] = '\0';
  pcVar49[0xfa] = -0x80;
  pcVar49[0xfb] = -1;
  pcVar49[0xfc] = '\0';
  pcVar49[0xfd] = '\0';
  pcVar49[0xfe] = -0x80;
  pcVar49[0xff] = -1;
  pcVar49[0xa0] = '\0';
  pcVar49[0xa1] = '\0';
  pcVar49[0xa2] = -0x80;
  pcVar49[0xa3] = -1;
  pcVar49[0xa4] = '\0';
  pcVar49[0xa5] = '\0';
  pcVar49[0xa6] = -0x80;
  pcVar49[0xa7] = -1;
  pcVar49[0xa8] = '\0';
  pcVar49[0xa9] = '\0';
  pcVar49[0xaa] = -0x80;
  pcVar49[0xab] = -1;
  pcVar49[0xac] = '\0';
  pcVar49[0xad] = '\0';
  pcVar49[0xae] = -0x80;
  pcVar49[0xaf] = -1;
  pcVar49[0xb0] = '\0';
  pcVar49[0xb1] = '\0';
  pcVar49[0xb2] = -0x80;
  pcVar49[0xb3] = -1;
  pcVar49[0xb4] = '\0';
  pcVar49[0xb5] = '\0';
  pcVar49[0xb6] = -0x80;
  pcVar49[0xb7] = -1;
  pcVar49[0xb8] = '\0';
  pcVar49[0xb9] = '\0';
  pcVar49[0xba] = -0x80;
  pcVar49[0xbb] = -1;
  pcVar49[0xbc] = '\0';
  pcVar49[0xbd] = '\0';
  pcVar49[0xbe] = -0x80;
  pcVar49[0xbf] = -1;
  pcVar49[0x60] = '\0';
  pcVar49[0x61] = '\0';
  pcVar49[0x62] = -0x80;
  pcVar49[99] = -1;
  pcVar49[100] = '\0';
  pcVar49[0x65] = '\0';
  pcVar49[0x66] = -0x80;
  pcVar49[0x67] = -1;
  pcVar49[0x68] = '\0';
  pcVar49[0x69] = '\0';
  pcVar49[0x6a] = -0x80;
  pcVar49[0x6b] = -1;
  pcVar49[0x6c] = '\0';
  pcVar49[0x6d] = '\0';
  pcVar49[0x6e] = -0x80;
  pcVar49[0x6f] = -1;
  pcVar49[0x70] = '\0';
  pcVar49[0x71] = '\0';
  pcVar49[0x72] = -0x80;
  pcVar49[0x73] = -1;
  pcVar49[0x74] = '\0';
  pcVar49[0x75] = '\0';
  pcVar49[0x76] = -0x80;
  pcVar49[0x77] = -1;
  pcVar49[0x78] = '\0';
  pcVar49[0x79] = '\0';
  pcVar49[0x7a] = -0x80;
  pcVar49[0x7b] = -1;
  pcVar49[0x7c] = '\0';
  pcVar49[0x7d] = '\0';
  pcVar49[0x7e] = -0x80;
  pcVar49[0x7f] = -1;
  auVar72 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar49 + 0x100) = auVar72;
  *(undefined1 (*) [32])(pcVar49 + 0x120) = auVar72;
  auVar72 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar49 + 0x140) = auVar72;
  *(undefined1 (*) [32])(pcVar49 + 0x160) = auVar72;
  *(undefined1 (*) [32])(pcVar49 + 0x180) = auVar72;
  *(undefined1 (*) [32])(pcVar49 + 0x1a0) = auVar72;
  lVar35 = 0;
  do {
    pcVar3 = pcVar49 + lVar35 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\b';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    pcVar3[0x10] = '\b';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pcVar3[0x14] = '\0';
    pcVar3[0x15] = '\0';
    pcVar3[0x16] = '\0';
    pcVar3[0x17] = '\0';
    pcVar3[0x18] = '\b';
    pcVar3[0x19] = '\0';
    pcVar3[0x1a] = '\0';
    pcVar3[0x1b] = '\0';
    pcVar3[0x1c] = '\0';
    pcVar3[0x1d] = '\0';
    pcVar3[0x1e] = '\0';
    pcVar3[0x1f] = '\0';
    lVar35 = lVar35 + 4;
  } while (lVar35 != 8);
  uVar39 = 6;
LAB_013f5800:
  in_00 = (BuildRecord *)&v0;
  local_1e48._8_4_ = 0xff800000;
  local_1e48._0_8_ = 0xff800000ff800000;
  local_1e48._12_4_ = 0xff800000;
  local_1e28._8_4_ = 0x7f800000;
  local_1e28._0_8_ = 0x7f8000007f800000;
  local_1e28._12_4_ = 0x7f800000;
  if (local_848 != 0) {
    pBVar44 = &values[0].dt;
    uVar60 = 0;
    local_1e28._8_4_ = 0x7f800000;
    local_1e28._0_8_ = 0x7f8000007f800000;
    local_1e28._12_4_ = 0x7f800000;
    local_1db8[0].i[2] = 0x7f800000;
    local_1db8[0]._0_8_ = 0x7f8000007f800000;
    local_1db8[0].i[3] = 0x7f800000;
    local_1e48._8_4_ = 0xff800000;
    local_1e48._0_8_ = 0xff800000ff800000;
    local_1e48._12_4_ = 0xff800000;
    local_1dc8.i[2] = 0xff800000;
    local_1dc8._0_8_ = 0xff800000ff800000;
    local_1dc8.i[3] = 0xff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&v2,this,in_00,alloc);
      vVar30 = v2;
      pBVar44[-10].lower = (float)v2.field_0.v[0]._0_4_;
      pBVar44[-10].upper = (float)v2.field_0._4_4_;
      auVar26._8_8_ = local_1bf8._8_8_;
      auVar26._0_8_ = local_1bf8._0_8_;
      *(undefined1 (*) [16])(pBVar44 + -8) = auVar26;
      pBVar44[-6].lower = (float)auStack_1be8._0_4_;
      pBVar44[-6].upper = (float)auStack_1be8._4_4_;
      pBVar44[-5].lower = (float)auStack_1be8._8_4_;
      pBVar44[-5].upper = (float)auStack_1be8._12_4_;
      pBVar44[-4].lower = (float)local_1bd8._0_4_;
      pBVar44[-4].upper = (float)local_1bd8._4_4_;
      pBVar44[-3].lower = (float)local_1bd8._8_4_;
      pBVar44[-3].upper = (float)local_1bd8._12_4_;
      pBVar44[-2].lower = (float)aStack_1bc8._0_4_;
      pBVar44[-2].upper = aStack_1bc8.m128[1];
      pBVar44[-1].lower = (float)aStack_1bc8._8_4_;
      pBVar44[-1].upper = aStack_1bc8.m128[3];
      pBVar44->lower = (float)local_1bb8._0_4_;
      pBVar44->upper = local_1bb8.m128[1];
      local_1e48 = vmaxps_avx(local_1e48,*(undefined1 (*) [16])(pBVar44 + -6));
      local_1db8[0].v = (__m128)vminps_avx(local_1db8[0].v,*(undefined1 (*) [16])(pBVar44 + -4));
      local_1e28 = vminps_avx(local_1e28,auVar26);
      local_1dc8.v = (__m128)vmaxps_avx(local_1dc8.v,*(undefined1 (*) [16])(pBVar44 + -2));
      uVar60 = uVar60 + 1;
      pBVar44 = pBVar44 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
      v2 = vVar30;
    } while (uVar60 < local_848);
  }
  if (((uint)uVar39 | (uint)pcVar49 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar50 = (ulong)pcVar49 & 0xfffffffffffffff0;
      pfVar40 = &values[0].dt.upper;
      uVar60 = 0;
      auVar83._8_4_ = 0x7f7fffff;
      auVar83._0_8_ = 0x7f7fffff7f7fffff;
      auVar83._12_4_ = 0x7f7fffff;
      auVar85._8_4_ = 0xff7fffff;
      auVar85._0_8_ = 0xff7fffffff7fffff;
      auVar85._12_4_ = 0xff7fffff;
      auVar91._8_4_ = 0x7fffffff;
      auVar91._0_8_ = 0x7fffffff7fffffff;
      auVar91._12_4_ = 0x7fffffff;
      do {
        *(undefined8 *)(uVar50 + uVar60 * 8) = *(undefined8 *)(pfVar40 + -0x15);
        fVar5 = ((BBox1f *)(pfVar40 + -1))->lower;
        fVar97 = 1.0 / (*pfVar40 - fVar5);
        fVar102 = -fVar5 * fVar97;
        auVar65 = vshufps_avx(ZEXT416((uint)fVar102),ZEXT416((uint)fVar102),0);
        auVar67 = vshufps_avx(ZEXT416((uint)(1.0 - fVar102)),ZEXT416((uint)(1.0 - fVar102)),0);
        auVar116._0_4_ = pfVar40[-9] * auVar65._0_4_ + pfVar40[-0x11] * auVar67._0_4_;
        auVar116._4_4_ = pfVar40[-8] * auVar65._4_4_ + pfVar40[-0x10] * auVar67._4_4_;
        auVar116._8_4_ = pfVar40[-7] * auVar65._8_4_ + pfVar40[-0xf] * auVar67._8_4_;
        auVar116._12_4_ = pfVar40[-6] * auVar65._12_4_ + pfVar40[-0xe] * auVar67._12_4_;
        auVar103._0_4_ = pfVar40[-5] * auVar65._0_4_ + pfVar40[-0xd] * auVar67._0_4_;
        auVar103._4_4_ = pfVar40[-4] * auVar65._4_4_ + pfVar40[-0xc] * auVar67._4_4_;
        auVar103._8_4_ = pfVar40[-3] * auVar65._8_4_ + pfVar40[-0xb] * auVar67._8_4_;
        auVar103._12_4_ = pfVar40[-2] * auVar65._12_4_ + pfVar40[-10] * auVar67._12_4_;
        fVar97 = (1.0 - fVar5) * fVar97;
        auVar65 = vshufps_avx(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),0);
        auVar67 = vshufps_avx(ZEXT416((uint)(1.0 - fVar97)),ZEXT416((uint)(1.0 - fVar97)),0);
        auVar108._0_4_ = pfVar40[-9] * auVar65._0_4_ + pfVar40[-0x11] * auVar67._0_4_;
        auVar108._4_4_ = pfVar40[-8] * auVar65._4_4_ + pfVar40[-0x10] * auVar67._4_4_;
        auVar108._8_4_ = pfVar40[-7] * auVar65._8_4_ + pfVar40[-0xf] * auVar67._8_4_;
        auVar108._12_4_ = pfVar40[-6] * auVar65._12_4_ + pfVar40[-0xe] * auVar67._12_4_;
        auVar98._0_4_ = pfVar40[-5] * auVar65._0_4_ + pfVar40[-0xd] * auVar67._0_4_;
        auVar98._4_4_ = pfVar40[-4] * auVar65._4_4_ + pfVar40[-0xc] * auVar67._4_4_;
        auVar98._8_4_ = pfVar40[-3] * auVar65._8_4_ + pfVar40[-0xb] * auVar67._8_4_;
        auVar98._12_4_ = pfVar40[-2] * auVar65._12_4_ + pfVar40[-10] * auVar67._12_4_;
        auVar79 = vminps_avx(auVar116,auVar83);
        auVar67 = vmaxps_avx(auVar103,auVar85);
        auVar75 = vminps_avx(auVar108,auVar83);
        auVar66 = vmaxps_avx(auVar98,auVar85);
        auVar65 = vandps_avx(auVar79,auVar91);
        auVar110._0_4_ = auVar65._0_4_ * 4.7683716e-07;
        auVar110._4_4_ = auVar65._4_4_ * 4.7683716e-07;
        auVar110._8_4_ = auVar65._8_4_ * 4.7683716e-07;
        auVar110._12_4_ = auVar65._12_4_ * 4.7683716e-07;
        auVar79 = vsubps_avx(auVar79,auVar110);
        auVar65 = vandps_avx(auVar67,auVar91);
        auVar104._0_4_ = auVar67._0_4_ + auVar65._0_4_ * 4.7683716e-07;
        auVar104._4_4_ = auVar67._4_4_ + auVar65._4_4_ * 4.7683716e-07;
        auVar104._8_4_ = auVar67._8_4_ + auVar65._8_4_ * 4.7683716e-07;
        auVar104._12_4_ = auVar67._12_4_ + auVar65._12_4_ * 4.7683716e-07;
        auVar65 = vandps_avx(auVar75,auVar91);
        auVar111._0_4_ = auVar65._0_4_ * 4.7683716e-07;
        auVar111._4_4_ = auVar65._4_4_ * 4.7683716e-07;
        auVar111._8_4_ = auVar65._8_4_ * 4.7683716e-07;
        auVar111._12_4_ = auVar65._12_4_ * 4.7683716e-07;
        auVar67 = vsubps_avx(auVar75,auVar111);
        auVar65 = vandps_avx(auVar66,auVar91);
        *(int *)(uVar50 + 0x40 + uVar60 * 4) = auVar79._0_4_;
        uVar8 = vextractps_avx(auVar79,1);
        *(undefined4 *)(uVar50 + 0x80 + uVar60 * 4) = uVar8;
        auVar99._0_4_ = auVar65._0_4_ * 4.7683716e-07 + auVar66._0_4_;
        auVar99._4_4_ = auVar65._4_4_ * 4.7683716e-07 + auVar66._4_4_;
        auVar99._8_4_ = auVar65._8_4_ * 4.7683716e-07 + auVar66._8_4_;
        auVar99._12_4_ = auVar65._12_4_ * 4.7683716e-07 + auVar66._12_4_;
        uVar8 = vextractps_avx(auVar79,2);
        *(undefined4 *)(uVar50 + 0xc0 + uVar60 * 4) = uVar8;
        *(float *)(uVar50 + 0x60 + uVar60 * 4) = auVar104._0_4_;
        uVar8 = vextractps_avx(auVar104,1);
        *(undefined4 *)(uVar50 + 0xa0 + uVar60 * 4) = uVar8;
        auVar65 = vsubps_avx(auVar67,auVar79);
        uVar8 = vextractps_avx(auVar104,2);
        *(undefined4 *)(uVar50 + 0xe0 + uVar60 * 4) = uVar8;
        *(int *)(uVar50 + 0x100 + uVar60 * 4) = auVar65._0_4_;
        uVar8 = vextractps_avx(auVar65,1);
        *(undefined4 *)(uVar50 + 0x140 + uVar60 * 4) = uVar8;
        auVar67 = vsubps_avx(auVar99,auVar104);
        uVar8 = vextractps_avx(auVar65,2);
        *(undefined4 *)(uVar50 + 0x180 + uVar60 * 4) = uVar8;
        *(int *)(uVar50 + 0x120 + uVar60 * 4) = auVar67._0_4_;
        uVar8 = vextractps_avx(auVar67,1);
        *(undefined4 *)(uVar50 + 0x160 + uVar60 * 4) = uVar8;
        uVar8 = vextractps_avx(auVar67,2);
        *(undefined4 *)(uVar50 + 0x1a0 + uVar60 * 4) = uVar8;
        uVar60 = uVar60 + 1;
        pfVar40 = pfVar40 + 0x18;
      } while (local_848 != uVar60);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<8>,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Set,embree::avx::CreateMSMBlurLeaf<8,embree::TriangleMesh,embree::TriangleMi<4>>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  uVar50 = uStack_1840;
  uVar60 = local_1848;
  if ((bVar33 & 1) == 0) {
    (__return_storage_ptr__->ref).ptr = uVar39 | (ulong)pcVar49;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1e28._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1e28._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e48._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e48._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1db8[0]._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1db8[0]._8_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)local_18a8;
    geomID.field_0.i[2] = 0x7f800000;
    geomID.field_0.v[0] = 0x7f8000007f800000;
    geomID.field_0.i[3] = 0x7f800000;
    local_1b08._0_8_ = 0xff800000ff800000;
    local_1b08._8_8_ = 0xff800000ff800000;
    uStack_1af8 = 0x7f8000007f800000;
    uStack_1af0 = 0x7f8000007f800000;
    local_1ae8 = 0xff800000ff800000;
    uStack_1ae0 = 0xff800000ff800000;
    if (uStack_1840 - local_1848 < 0xc00) {
      v2.field_0.v[1] = uStack_1840;
      v2.field_0.v[0] = local_1848;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&left,(anon_class_16_2_aeee9775 *)&vSplitPos,
                 (range<unsigned_long> *)&v2);
    }
    else {
      v2.field_0.v[1]._4_2_ = 0x401;
      auStack_1be8._0_4_ = 0.0;
      auStack_1be8._4_4_ = 0.0;
      auStack_1be8._8_4_ = 0.0;
      auStack_1be8._12_4_ = 0.0;
      aStack_1bc8.m128[0] = 1.12104e-44;
      aStack_1bc8.m128[1] = 0.0;
      tbb::detail::r1::initialize((task_group_context *)&v2);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar50;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar60;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&left,(d1 *)&right,(blocked_range<unsigned_long> *)&geomID
                 ,(LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,(anon_class_1_0_00000001 *)&v2,
                 (task_group_context *)
                 new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl);
      cVar34 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&v2);
      if (cVar34 != '\0') {
        prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar43,"task cancelled");
        __cxa_throw(prVar43,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&v2);
    }
    (__return_storage_ptr__->ref).ptr = uVar39 | (ulong)pcVar49;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[2]);
    local_1dc8._0_8_ =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0.m128[0]);
    local_1dc8._8_8_ =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0.m128[2]);
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1dc8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1dc8._8_8_;
  __return_storage_ptr__->dt = BStack_1820;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar39 = 0;
  do {
    pBVar16 = local_8c8[uVar39];
    pBVar44 = pBVar16 + 1;
    *pBVar44 = (BBox1f)((long)*pBVar44 + -1);
    if ((*pBVar44 == (BBox1f)0x0) && (BVar9 = *pBVar16, BVar9 != (BBox1f)0x0)) {
      lVar35 = *(undefined8 *)((long)BVar9 + 0x18);
      pvVar38 = *(void **)((long)BVar9 + 0x20);
      if (pvVar38 != (void *)0x0) {
        if ((ulong)(lVar35 * 0x50) < 0x1c00000) {
          alignedFree(pvVar38);
        }
        else {
          os_free(pvVar38,lVar35 * 0x50,*(bool *)((long)BVar9 + 8));
        }
      }
      if (lVar35 != 0) {
        (**(code **)**(undefined8 **)BVar9)(*(undefined8 **)BVar9,lVar35 * -0x50,1);
      }
      *(undefined8 *)((long)BVar9 + 0x10) = 0;
      *(undefined8 *)((long)BVar9 + 0x18) = 0;
      *(undefined8 *)((long)BVar9 + 0x20) = 0;
      operator_delete((void *)BVar9);
    }
    uVar39 = uVar39 + 1;
  } while (uVar39 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }